

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

void embree::avx512::CurveNiMBIntersectorK<8,4>::
     intersect_n<embree::avx512::OrientedCurve1IntersectorK<embree::BSplineCurveT,4>,embree::avx512::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  long lVar1;
  long lVar2;
  BBox1f BVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  uint uVar6;
  uint uVar7;
  Geometry *pGVar8;
  __int_type_conflict _Var9;
  long lVar10;
  long lVar11;
  long lVar12;
  RTCFilterFunctionN p_Var13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  byte bVar20;
  uint uVar21;
  ulong uVar22;
  ulong uVar23;
  uint uVar24;
  long lVar25;
  long lVar26;
  ulong uVar27;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  int iVar129;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  ulong uVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  ulong uVar33;
  int iVar34;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  int iVar127;
  int iVar128;
  int iVar130;
  int iVar131;
  int iVar132;
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  int iVar133;
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar115 [32];
  undefined1 auVar117 [32];
  undefined1 auVar119 [32];
  undefined1 auVar121 [32];
  undefined1 auVar123 [32];
  undefined1 auVar125 [32];
  undefined4 uVar134;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  vfloat4 a0_1;
  undefined1 auVar140 [16];
  vfloat4 a0_2;
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  vfloat4 a0;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  float fVar150;
  float fVar151;
  float fVar155;
  float fVar156;
  float fVar157;
  vfloat4 b0;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  float fVar158;
  undefined1 auVar154 [32];
  float fVar159;
  float fVar167;
  __m128 a_1;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar176;
  __m128 a;
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [32];
  float fVar177;
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  float fVar183;
  undefined1 auVar182 [32];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [32];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [32];
  vfloat4 a0_3;
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  float fVar206;
  float fVar214;
  float fVar215;
  vfloat4 b0_2;
  float fVar216;
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  float fVar217;
  float fVar218;
  float fVar219;
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  vfloat4 a0_4;
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [64];
  undefined1 auVar243 [64];
  undefined1 auVar244 [64];
  undefined1 auVar245 [64];
  undefined1 auVar246 [64];
  undefined1 auVar247 [64];
  undefined1 auVar248 [64];
  undefined1 auVar249 [64];
  undefined1 auVar250 [64];
  vfloat_impl<4> p00;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  undefined1 local_388 [16];
  ulong local_378;
  Primitive *local_370;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  undefined8 local_318;
  undefined8 uStack_310;
  float local_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  RTCHitN local_108 [16];
  undefined1 local_f8 [16];
  undefined4 local_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  undefined1 local_c8 [16];
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined1 local_a8 [16];
  uint local_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint uStack_80;
  uint uStack_7c;
  undefined1 local_78 [32];
  BBox1f cv_stack [4];
  undefined1 auVar116 [32];
  undefined1 auVar118 [32];
  undefined1 auVar120 [32];
  undefined1 auVar122 [32];
  undefined1 auVar124 [32];
  undefined1 auVar126 [32];
  undefined1 auVar235 [32];
  
  uVar22 = (ulong)(byte)prim[1];
  auVar37._8_8_ = 0;
  auVar37._0_8_ = *(ulong *)(prim + uVar22 * 4 + 6);
  auVar105 = vpmovsxbd_avx2(auVar37);
  auVar35._8_8_ = 0;
  auVar35._0_8_ = *(ulong *)(prim + uVar22 * 5 + 6);
  auVar103 = vpmovsxbd_avx2(auVar35);
  auVar36._8_8_ = 0;
  auVar36._0_8_ = *(ulong *)(prim + uVar22 * 6 + 6);
  auVar106 = vpmovsxbd_avx2(auVar36);
  auVar52._8_8_ = 0;
  auVar52._0_8_ = *(ulong *)(prim + uVar22 * 0xf + 6);
  auVar95 = vpmovsxbd_avx2(auVar52);
  lVar25 = uVar22 * 0x25;
  auVar48._8_8_ = 0;
  auVar48._0_8_ = *(ulong *)(prim + (ulong)(byte)prim[1] * 0x10 + 6);
  auVar96 = vpmovsxbd_avx2(auVar48);
  auVar51._8_8_ = 0;
  auVar51._0_8_ = *(ulong *)(prim + uVar22 * 0x11 + 6);
  auVar104 = vpmovsxbd_avx2(auVar51);
  auVar53._8_8_ = 0;
  auVar53._0_8_ = *(ulong *)(prim + uVar22 * 0x1a + 6);
  auVar97 = vpmovsxbd_avx2(auVar53);
  auVar49._8_8_ = 0;
  auVar49._0_8_ = *(ulong *)(prim + uVar22 * 0x1b + 6);
  auVar90 = vpmovsxbd_avx512vl(auVar49);
  auVar50._8_8_ = 0;
  auVar50._0_8_ = *(ulong *)(prim + uVar22 * 0x1c + 6);
  auVar91 = vpmovsxbd_avx512vl(auVar50);
  auVar35 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(prim + lVar25 + 0x12)));
  auVar37 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar37 = vinsertps_avx(auVar37,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar36 = vsubps_avx512vl(auVar37,*(undefined1 (*) [16])(prim + lVar25 + 6));
  fVar169 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar25 + 0x16)) *
            *(float *)(prim + lVar25 + 0x1a);
  auVar107 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar22 * 7 + 6));
  auVar108 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar22 * 0xb + 6));
  auVar109 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar22 * 9 + 6));
  auVar110 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar22 * 0xd + 6));
  auVar111 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar22 * 0x12 + 6));
  auVar112 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar22 * 0x16 + 6));
  auVar113 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar22 * 0x14 + 6));
  auVar114 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar22 * 0x18 + 6));
  auVar37 = vinsertps_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                              ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar37 = vinsertps_avx512f(auVar37,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar36 = vmulps_avx512vl(auVar35,auVar36);
  auVar37 = vmulps_avx512vl(auVar35,auVar37);
  auVar92 = vcvtdq2ps_avx512vl(auVar105);
  auVar93 = vcvtdq2ps_avx512vl(auVar103);
  auVar94 = vcvtdq2ps_avx512vl(auVar106);
  auVar95 = vcvtdq2ps_avx512vl(auVar95);
  auVar96 = vcvtdq2ps_avx512vl(auVar96);
  auVar105 = vcvtdq2ps_avx(auVar104);
  auVar106 = vcvtdq2ps_avx(auVar97);
  auVar97 = vcvtdq2ps_avx512vl(auVar90);
  auVar90 = vcvtdq2ps_avx512vl(auVar91);
  auVar91 = vbroadcastss_avx512vl(auVar37);
  auVar98 = vbroadcastss_avx512vl(ZEXT416(1));
  auVar99 = vpermps_avx512vl(auVar98,ZEXT1632(auVar37));
  auVar100 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar101 = vpermps_avx512vl(auVar100,ZEXT1632(auVar37));
  auVar102 = vmulps_avx512vl(auVar101,auVar94);
  auVar104._4_4_ = auVar101._4_4_ * auVar105._4_4_;
  auVar104._0_4_ = auVar101._0_4_ * auVar105._0_4_;
  auVar104._8_4_ = auVar101._8_4_ * auVar105._8_4_;
  auVar104._12_4_ = auVar101._12_4_ * auVar105._12_4_;
  auVar104._16_4_ = auVar101._16_4_ * auVar105._16_4_;
  auVar104._20_4_ = auVar101._20_4_ * auVar105._20_4_;
  auVar104._24_4_ = auVar101._24_4_ * auVar105._24_4_;
  auVar104._28_4_ = auVar103._28_4_;
  auVar103 = vmulps_avx512vl(auVar101,auVar90);
  auVar101 = vfmadd231ps_avx512vl(auVar102,auVar99,auVar93);
  auVar104 = vfmadd231ps_avx512vl(auVar104,auVar99,auVar96);
  auVar103 = vfmadd231ps_avx512vl(auVar103,auVar97,auVar99);
  auVar99 = vfmadd231ps_avx512vl(auVar101,auVar91,auVar92);
  auVar104 = vfmadd231ps_avx512vl(auVar104,auVar91,auVar95);
  auVar37 = vfmadd231ps_fma(auVar103,auVar106,auVar91);
  auVar103 = vbroadcastss_avx512vl(auVar36);
  auVar91 = vpermps_avx512vl(auVar98,ZEXT1632(auVar36));
  auVar98 = vpermps_avx512vl(auVar100,ZEXT1632(auVar36));
  auVar94 = vmulps_avx512vl(auVar98,auVar94);
  auVar105 = vmulps_avx512vl(auVar98,auVar105);
  auVar90 = vmulps_avx512vl(auVar98,auVar90);
  auVar93 = vfmadd231ps_avx512vl(auVar94,auVar91,auVar93);
  auVar105 = vfmadd231ps_avx512vl(auVar105,auVar91,auVar96);
  auVar96 = vfmadd231ps_avx512vl(auVar90,auVar91,auVar97);
  auVar90 = vfmadd231ps_avx512vl(auVar93,auVar103,auVar92);
  auVar95 = vfmadd231ps_avx512vl(auVar105,auVar103,auVar95);
  auVar103 = vfmadd231ps_avx512vl(auVar96,auVar103,auVar106);
  auVar98._8_4_ = 0x7fffffff;
  auVar98._0_8_ = 0x7fffffff7fffffff;
  auVar98._12_4_ = 0x7fffffff;
  auVar98._16_4_ = 0x7fffffff;
  auVar98._20_4_ = 0x7fffffff;
  auVar98._24_4_ = 0x7fffffff;
  auVar98._28_4_ = 0x7fffffff;
  auVar105 = vandps_avx(auVar98,auVar99);
  auVar106 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
  uVar28 = vcmpps_avx512vl(auVar105,auVar106,1);
  bVar31 = (bool)((byte)uVar28 & 1);
  iVar34 = auVar106._0_4_;
  auVar92._0_4_ = (uint)bVar31 * iVar34 | (uint)!bVar31 * auVar99._0_4_;
  bVar31 = (bool)((byte)(uVar28 >> 1) & 1);
  iVar127 = auVar106._4_4_;
  auVar92._4_4_ = (uint)bVar31 * iVar127 | (uint)!bVar31 * auVar99._4_4_;
  bVar31 = (bool)((byte)(uVar28 >> 2) & 1);
  iVar128 = auVar106._8_4_;
  auVar92._8_4_ = (uint)bVar31 * iVar128 | (uint)!bVar31 * auVar99._8_4_;
  bVar31 = (bool)((byte)(uVar28 >> 3) & 1);
  iVar129 = auVar106._12_4_;
  auVar92._12_4_ = (uint)bVar31 * iVar129 | (uint)!bVar31 * auVar99._12_4_;
  bVar31 = (bool)((byte)(uVar28 >> 4) & 1);
  iVar130 = auVar106._16_4_;
  auVar92._16_4_ = (uint)bVar31 * iVar130 | (uint)!bVar31 * auVar99._16_4_;
  bVar31 = (bool)((byte)(uVar28 >> 5) & 1);
  iVar131 = auVar106._20_4_;
  auVar92._20_4_ = (uint)bVar31 * iVar131 | (uint)!bVar31 * auVar99._20_4_;
  bVar31 = (bool)((byte)(uVar28 >> 6) & 1);
  iVar132 = auVar106._24_4_;
  iVar133 = auVar106._28_4_;
  auVar92._24_4_ = (uint)bVar31 * iVar132 | (uint)!bVar31 * auVar99._24_4_;
  bVar31 = SUB81(uVar28 >> 7,0);
  auVar92._28_4_ = (uint)bVar31 * iVar133 | (uint)!bVar31 * auVar99._28_4_;
  auVar105 = vandps_avx(auVar98,auVar104);
  uVar28 = vcmpps_avx512vl(auVar105,auVar106,1);
  bVar31 = (bool)((byte)uVar28 & 1);
  auVar93._0_4_ = (uint)bVar31 * iVar34 | (uint)!bVar31 * auVar104._0_4_;
  bVar31 = (bool)((byte)(uVar28 >> 1) & 1);
  auVar93._4_4_ = (uint)bVar31 * iVar127 | (uint)!bVar31 * auVar104._4_4_;
  bVar31 = (bool)((byte)(uVar28 >> 2) & 1);
  auVar93._8_4_ = (uint)bVar31 * iVar128 | (uint)!bVar31 * auVar104._8_4_;
  bVar31 = (bool)((byte)(uVar28 >> 3) & 1);
  auVar93._12_4_ = (uint)bVar31 * iVar129 | (uint)!bVar31 * auVar104._12_4_;
  bVar31 = (bool)((byte)(uVar28 >> 4) & 1);
  auVar93._16_4_ = (uint)bVar31 * iVar130 | (uint)!bVar31 * auVar104._16_4_;
  bVar31 = (bool)((byte)(uVar28 >> 5) & 1);
  auVar93._20_4_ = (uint)bVar31 * iVar131 | (uint)!bVar31 * auVar104._20_4_;
  bVar31 = (bool)((byte)(uVar28 >> 6) & 1);
  auVar93._24_4_ = (uint)bVar31 * iVar132 | (uint)!bVar31 * auVar104._24_4_;
  bVar31 = SUB81(uVar28 >> 7,0);
  auVar93._28_4_ = (uint)bVar31 * iVar133 | (uint)!bVar31 * auVar104._28_4_;
  auVar105 = vandps_avx(auVar98,ZEXT1632(auVar37));
  uVar28 = vcmpps_avx512vl(auVar105,auVar106,1);
  bVar31 = (bool)((byte)uVar28 & 1);
  auVar105._0_4_ = (uint)bVar31 * iVar34 | (uint)!bVar31 * auVar37._0_4_;
  bVar31 = (bool)((byte)(uVar28 >> 1) & 1);
  auVar105._4_4_ = (uint)bVar31 * iVar127 | (uint)!bVar31 * auVar37._4_4_;
  bVar31 = (bool)((byte)(uVar28 >> 2) & 1);
  auVar105._8_4_ = (uint)bVar31 * iVar128 | (uint)!bVar31 * auVar37._8_4_;
  bVar31 = (bool)((byte)(uVar28 >> 3) & 1);
  auVar105._12_4_ = (uint)bVar31 * iVar129 | (uint)!bVar31 * auVar37._12_4_;
  auVar105._16_4_ = (uint)((byte)(uVar28 >> 4) & 1) * iVar130;
  auVar105._20_4_ = (uint)((byte)(uVar28 >> 5) & 1) * iVar131;
  auVar105._24_4_ = (uint)((byte)(uVar28 >> 6) & 1) * iVar132;
  auVar105._28_4_ = (uint)(byte)(uVar28 >> 7) * iVar133;
  auVar99._8_4_ = 0x3f800000;
  auVar99._0_8_ = 0x3f8000003f800000;
  auVar99._12_4_ = 0x3f800000;
  auVar99._16_4_ = 0x3f800000;
  auVar99._20_4_ = 0x3f800000;
  auVar99._24_4_ = 0x3f800000;
  auVar99._28_4_ = 0x3f800000;
  auVar106 = vrcp14ps_avx512vl(auVar92);
  auVar37 = vfnmadd213ps_fma(auVar92,auVar106,auVar99);
  auVar37 = vfmadd132ps_fma(ZEXT1632(auVar37),auVar106,auVar106);
  auVar106 = vrcp14ps_avx512vl(auVar93);
  auVar35 = vfnmadd213ps_fma(auVar93,auVar106,auVar99);
  auVar35 = vfmadd132ps_fma(ZEXT1632(auVar35),auVar106,auVar106);
  auVar106 = vrcp14ps_avx512vl(auVar105);
  auVar36 = vfnmadd213ps_fma(auVar105,auVar106,auVar99);
  auVar36 = vfmadd132ps_fma(ZEXT1632(auVar36),auVar106,auVar106);
  auVar94._4_4_ = fVar169;
  auVar94._0_4_ = fVar169;
  auVar94._8_4_ = fVar169;
  auVar94._12_4_ = fVar169;
  auVar94._16_4_ = fVar169;
  auVar94._20_4_ = fVar169;
  auVar94._24_4_ = fVar169;
  auVar94._28_4_ = fVar169;
  auVar105 = vcvtdq2ps_avx(auVar107);
  auVar106 = vcvtdq2ps_avx(auVar108);
  auVar106 = vsubps_avx(auVar106,auVar105);
  auVar52 = vfmadd213ps_fma(auVar106,auVar94,auVar105);
  auVar105 = vcvtdq2ps_avx(auVar109);
  auVar106 = vcvtdq2ps_avx(auVar110);
  auVar106 = vsubps_avx(auVar106,auVar105);
  auVar48 = vfmadd213ps_fma(auVar106,auVar94,auVar105);
  auVar105 = vcvtdq2ps_avx(auVar111);
  auVar106 = vcvtdq2ps_avx(auVar112);
  auVar106 = vsubps_avx(auVar106,auVar105);
  auVar51 = vfmadd213ps_fma(auVar106,auVar94,auVar105);
  auVar105 = vcvtdq2ps_avx(auVar113);
  auVar106 = vcvtdq2ps_avx(auVar114);
  auVar106 = vsubps_avx(auVar106,auVar105);
  auVar53 = vfmadd213ps_fma(auVar106,auVar94,auVar105);
  auVar105 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar22 * 0x1d + 6));
  auVar106 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar22 * 0x21 + 6));
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar106 = vsubps_avx(auVar106,auVar105);
  auVar49 = vfmadd213ps_fma(auVar106,auVar94,auVar105);
  auVar105 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar22 * 0x1f + 6));
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar106 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar22 * 0x23 + 6));
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar106 = vsubps_avx(auVar106,auVar105);
  auVar50 = vfmadd213ps_fma(auVar106,auVar94,auVar105);
  auVar105 = vsubps_avx512vl(ZEXT1632(auVar52),auVar90);
  auVar97._4_4_ = auVar37._4_4_ * auVar105._4_4_;
  auVar97._0_4_ = auVar37._0_4_ * auVar105._0_4_;
  auVar97._8_4_ = auVar37._8_4_ * auVar105._8_4_;
  auVar97._12_4_ = auVar37._12_4_ * auVar105._12_4_;
  auVar97._16_4_ = auVar105._16_4_ * 0.0;
  auVar97._20_4_ = auVar105._20_4_ * 0.0;
  auVar97._24_4_ = auVar105._24_4_ * 0.0;
  auVar97._28_4_ = auVar105._28_4_;
  auVar105 = vsubps_avx512vl(ZEXT1632(auVar48),auVar90);
  auVar111._0_4_ = auVar37._0_4_ * auVar105._0_4_;
  auVar111._4_4_ = auVar37._4_4_ * auVar105._4_4_;
  auVar111._8_4_ = auVar37._8_4_ * auVar105._8_4_;
  auVar111._12_4_ = auVar37._12_4_ * auVar105._12_4_;
  auVar111._16_4_ = auVar105._16_4_ * 0.0;
  auVar111._20_4_ = auVar105._20_4_ * 0.0;
  auVar111._24_4_ = auVar105._24_4_ * 0.0;
  auVar111._28_4_ = 0;
  auVar105 = vsubps_avx(ZEXT1632(auVar51),auVar95);
  auVar107._4_4_ = auVar35._4_4_ * auVar105._4_4_;
  auVar107._0_4_ = auVar35._0_4_ * auVar105._0_4_;
  auVar107._8_4_ = auVar35._8_4_ * auVar105._8_4_;
  auVar107._12_4_ = auVar35._12_4_ * auVar105._12_4_;
  auVar107._16_4_ = auVar105._16_4_ * 0.0;
  auVar107._20_4_ = auVar105._20_4_ * 0.0;
  auVar107._24_4_ = auVar105._24_4_ * 0.0;
  auVar107._28_4_ = auVar105._28_4_;
  auVar105 = vsubps_avx(ZEXT1632(auVar53),auVar95);
  auVar110._0_4_ = auVar35._0_4_ * auVar105._0_4_;
  auVar110._4_4_ = auVar35._4_4_ * auVar105._4_4_;
  auVar110._8_4_ = auVar35._8_4_ * auVar105._8_4_;
  auVar110._12_4_ = auVar35._12_4_ * auVar105._12_4_;
  auVar110._16_4_ = auVar105._16_4_ * 0.0;
  auVar110._20_4_ = auVar105._20_4_ * 0.0;
  auVar110._24_4_ = auVar105._24_4_ * 0.0;
  auVar110._28_4_ = 0;
  auVar105 = vsubps_avx(ZEXT1632(auVar49),auVar103);
  auVar108._4_4_ = auVar36._4_4_ * auVar105._4_4_;
  auVar108._0_4_ = auVar36._0_4_ * auVar105._0_4_;
  auVar108._8_4_ = auVar36._8_4_ * auVar105._8_4_;
  auVar108._12_4_ = auVar36._12_4_ * auVar105._12_4_;
  auVar108._16_4_ = auVar105._16_4_ * 0.0;
  auVar108._20_4_ = auVar105._20_4_ * 0.0;
  auVar108._24_4_ = auVar105._24_4_ * 0.0;
  auVar108._28_4_ = auVar105._28_4_;
  auVar105 = vsubps_avx(ZEXT1632(auVar50),auVar103);
  auVar109._0_4_ = auVar36._0_4_ * auVar105._0_4_;
  auVar109._4_4_ = auVar36._4_4_ * auVar105._4_4_;
  auVar109._8_4_ = auVar36._8_4_ * auVar105._8_4_;
  auVar109._12_4_ = auVar36._12_4_ * auVar105._12_4_;
  auVar109._16_4_ = auVar105._16_4_ * 0.0;
  auVar109._20_4_ = auVar105._20_4_ * 0.0;
  auVar109._24_4_ = auVar105._24_4_ * 0.0;
  auVar109._28_4_ = 0;
  auVar105 = vpminsd_avx2(auVar97,auVar111);
  auVar106 = vpminsd_avx2(auVar107,auVar110);
  auVar105 = vmaxps_avx(auVar105,auVar106);
  auVar106 = vpminsd_avx2(auVar108,auVar109);
  uVar134 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar103._4_4_ = uVar134;
  auVar103._0_4_ = uVar134;
  auVar103._8_4_ = uVar134;
  auVar103._12_4_ = uVar134;
  auVar103._16_4_ = uVar134;
  auVar103._20_4_ = uVar134;
  auVar103._24_4_ = uVar134;
  auVar103._28_4_ = uVar134;
  auVar106 = vmaxps_avx512vl(auVar106,auVar103);
  auVar105 = vmaxps_avx(auVar105,auVar106);
  auVar106._8_4_ = 0x3f7ffffa;
  auVar106._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar106._12_4_ = 0x3f7ffffa;
  auVar106._16_4_ = 0x3f7ffffa;
  auVar106._20_4_ = 0x3f7ffffa;
  auVar106._24_4_ = 0x3f7ffffa;
  auVar106._28_4_ = 0x3f7ffffa;
  local_78 = vmulps_avx512vl(auVar105,auVar106);
  auVar105 = vpmaxsd_avx2(auVar97,auVar111);
  auVar106 = vpmaxsd_avx2(auVar107,auVar110);
  auVar105 = vminps_avx(auVar105,auVar106);
  auVar106 = vpmaxsd_avx2(auVar108,auVar109);
  uVar134 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar95._4_4_ = uVar134;
  auVar95._0_4_ = uVar134;
  auVar95._8_4_ = uVar134;
  auVar95._12_4_ = uVar134;
  auVar95._16_4_ = uVar134;
  auVar95._20_4_ = uVar134;
  auVar95._24_4_ = uVar134;
  auVar95._28_4_ = uVar134;
  auVar106 = vminps_avx512vl(auVar106,auVar95);
  auVar105 = vminps_avx(auVar105,auVar106);
  auVar96._8_4_ = 0x3f800003;
  auVar96._0_8_ = 0x3f8000033f800003;
  auVar96._12_4_ = 0x3f800003;
  auVar96._16_4_ = 0x3f800003;
  auVar96._20_4_ = 0x3f800003;
  auVar96._24_4_ = 0x3f800003;
  auVar96._28_4_ = 0x3f800003;
  auVar105 = vmulps_avx512vl(auVar105,auVar96);
  auVar106 = vpbroadcastd_avx512vl();
  uVar14 = vcmpps_avx512vl(local_78,auVar105,2);
  uVar15 = vpcmpgtd_avx512vl(auVar106,_DAT_01fb4ba0);
  uVar28 = (ulong)(byte)((byte)uVar14 & (byte)uVar15);
  auVar37 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar35 = vxorps_avx512vl(auVar91._0_16_,auVar91._0_16_);
  auVar242 = ZEXT1664(auVar35);
  auVar35 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
  auVar250 = ZEXT1664(auVar35);
  local_370 = prim;
LAB_01b4b986:
  if (uVar28 == 0) {
    return;
  }
  lVar25 = 0;
  for (uVar22 = uVar28; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000) {
    lVar25 = lVar25 + 1;
  }
  uVar22 = (ulong)*(uint *)(local_370 + 2);
  pGVar8 = (context->scene->geometries).items[uVar22].ptr;
  fVar169 = (pGVar8->time_range).lower;
  fVar169 = pGVar8->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0x70) - fVar169) / ((pGVar8->time_range).upper - fVar169));
  auVar35 = vroundss_avx(ZEXT416((uint)fVar169),ZEXT416((uint)fVar169),9);
  uVar6 = *(uint *)(local_370 + lVar25 * 4 + 6);
  auVar36 = vaddss_avx512f(ZEXT416((uint)pGVar8->fnumTimeSegments),SUB6416(ZEXT464(0xbf800000),0));
  auVar35 = vminss_avx(auVar35,auVar36);
  auVar38 = vmaxss_avx512f(auVar242._0_16_,auVar35);
  uVar23 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                           (ulong)uVar6 *
                           pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var9 = pGVar8[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar26 = (long)(int)auVar38._0_4_ * 0x38;
  lVar10 = *(long *)(_Var9 + lVar26);
  lVar11 = *(long *)(_Var9 + 0x10 + lVar26);
  auVar35 = *(undefined1 (*) [16])(lVar10 + lVar11 * uVar23);
  lVar25 = uVar23 + 1;
  auVar36 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar25);
  lVar1 = uVar23 + 2;
  auVar52 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar1);
  lVar2 = uVar23 + 3;
  auVar48 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar2);
  lVar10 = *(long *)&pGVar8[4].fnumTimeSegments;
  lVar11 = *(long *)(lVar10 + lVar26);
  lVar12 = *(long *)(lVar10 + 0x10 + lVar26);
  auVar51 = *(undefined1 (*) [16])(lVar11 + lVar12 * uVar23);
  auVar53 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar25);
  auVar49 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar1);
  auVar50 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar2);
  lVar11 = *(long *)(_Var9 + 0x38 + lVar26);
  lVar12 = *(long *)(_Var9 + 0x48 + lVar26);
  auVar55 = *(undefined1 (*) [16])(lVar11 + lVar12 * uVar23);
  auVar56 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar25);
  auVar57 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar1);
  auVar135 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar2);
  lVar11 = *(long *)(lVar10 + 0x38 + lVar26);
  lVar10 = *(long *)(lVar10 + 0x48 + lVar26);
  auVar77 = *(undefined1 (*) [16])(lVar11 + uVar23 * lVar10);
  auVar66 = *(undefined1 (*) [16])(lVar11 + lVar25 * lVar10);
  auVar67 = *(undefined1 (*) [16])(lVar11 + lVar1 * lVar10);
  auVar39 = vsubss_avx512f(ZEXT416((uint)fVar169),auVar38);
  auVar58._0_12_ = ZEXT812(0);
  auVar58._12_4_ = 0;
  auVar38 = vmulps_avx512vl(auVar48,auVar58);
  auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaab));
  auVar41 = vfmadd213ps_avx512vl(auVar40,auVar52,auVar38);
  auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3f2aaaab));
  auVar41 = vfmadd231ps_avx512vl(auVar41,auVar36,auVar42);
  auVar43 = vfmadd231ps_avx512vl(auVar41,auVar35,auVar40);
  auVar59 = auVar250._0_16_;
  auVar38 = vfmadd231ps_avx512vl(auVar38,auVar52,auVar59);
  auVar38 = vfnmadd231ps_avx512vl(auVar38,auVar36,auVar58);
  auVar44 = vfnmadd231ps_avx512vl(auVar38,auVar35,auVar59);
  auVar46._0_4_ = auVar50._0_4_ * 0.0;
  auVar46._4_4_ = auVar50._4_4_ * 0.0;
  auVar46._8_4_ = auVar50._8_4_ * 0.0;
  auVar46._12_4_ = auVar50._12_4_ * 0.0;
  auVar38 = vfmadd213ps_avx512vl(auVar40,auVar49,auVar46);
  auVar38 = vfmadd231ps_avx512vl(auVar38,auVar53,auVar42);
  auVar45 = vfmadd231ps_avx512vl(auVar38,auVar51,auVar40);
  auVar38 = vfmadd231ps_avx512vl(auVar46,auVar49,auVar59);
  auVar38 = vfnmadd231ps_fma(auVar38,auVar53,auVar58);
  auVar46 = vfnmadd231ps_avx512vl(auVar38,auVar51,auVar59);
  auVar38 = vmulps_avx512vl(auVar48,auVar40);
  auVar38 = vfmadd231ps_avx512vl(auVar38,auVar52,auVar42);
  auVar38 = vfmadd231ps_avx512vl(auVar38,auVar36,auVar40);
  auVar47 = vfmadd231ps_avx512vl(auVar38,auVar35,auVar58);
  auVar48 = vmulps_avx512vl(auVar48,auVar59);
  auVar52 = vfmadd231ps_fma(auVar48,auVar58,auVar52);
  auVar36 = vfnmadd231ps_avx512vl(auVar52,auVar59,auVar36);
  auVar41 = vfnmadd231ps_fma(auVar36,auVar58,auVar35);
  auVar35 = vmulps_avx512vl(auVar50,auVar40);
  auVar35 = vfmadd231ps_avx512vl(auVar35,auVar49,auVar42);
  auVar35 = vfmadd231ps_avx512vl(auVar35,auVar53,auVar40);
  auVar38 = vfmadd231ps_fma(auVar35,auVar51,auVar58);
  auVar35 = vmulps_avx512vl(auVar50,auVar59);
  auVar35 = vfmadd231ps_fma(auVar35,auVar58,auVar49);
  auVar35 = vfnmadd231ps_avx512vl(auVar35,auVar59,auVar53);
  auVar53 = vfnmadd231ps_fma(auVar35,auVar58,auVar51);
  auVar36 = vshufps_avx512vl(auVar44,auVar44,0xc9);
  auVar35 = vshufps_avx512vl(auVar45,auVar45,0xc9);
  auVar35 = vmulps_avx512vl(auVar44,auVar35);
  auVar35 = vfmsub231ps_avx512vl(auVar35,auVar36,auVar45);
  auVar52 = vshufps_avx(auVar35,auVar35,0xc9);
  auVar35 = vshufps_avx(auVar46,auVar46,0xc9);
  auVar35 = vmulps_avx512vl(auVar44,auVar35);
  auVar35 = vfmsub231ps_fma(auVar35,auVar36,auVar46);
  auVar48 = vshufps_avx(auVar35,auVar35,0xc9);
  auVar35 = vshufps_avx(auVar41,auVar41,0xc9);
  auVar36 = vshufps_avx(auVar38,auVar38,0xc9);
  auVar60._0_4_ = auVar41._0_4_ * auVar36._0_4_;
  auVar60._4_4_ = auVar41._4_4_ * auVar36._4_4_;
  auVar60._8_4_ = auVar41._8_4_ * auVar36._8_4_;
  auVar60._12_4_ = auVar41._12_4_ * auVar36._12_4_;
  auVar36 = vfmsub231ps_fma(auVar60,auVar35,auVar38);
  auVar51 = vshufps_avx(auVar36,auVar36,0xc9);
  auVar36 = vshufps_avx(auVar53,auVar53,0xc9);
  auVar61._0_4_ = auVar41._0_4_ * auVar36._0_4_;
  auVar61._4_4_ = auVar41._4_4_ * auVar36._4_4_;
  auVar61._8_4_ = auVar41._8_4_ * auVar36._8_4_;
  auVar61._12_4_ = auVar41._12_4_ * auVar36._12_4_;
  auVar35 = vfmsub231ps_fma(auVar61,auVar35,auVar53);
  auVar53 = vshufps_avx(auVar35,auVar35,0xc9);
  auVar35 = vdpps_avx(auVar52,auVar52,0x7f);
  auVar36 = vrsqrt14ss_avx512f(auVar58,ZEXT416(auVar35._0_4_));
  auVar49 = vmulss_avx512f(auVar36,ZEXT416(0x3fc00000));
  auVar50 = vmulss_avx512f(auVar35,ZEXT416(0xbf000000));
  auVar50 = vmulss_avx512f(auVar50,auVar36);
  auVar36 = vmulss_avx512f(auVar50,ZEXT416((uint)(auVar36._0_4_ * auVar36._0_4_)));
  fVar169 = auVar49._0_4_ + auVar36._0_4_;
  auVar68._4_4_ = fVar169;
  auVar68._0_4_ = fVar169;
  auVar68._8_4_ = fVar169;
  auVar68._12_4_ = fVar169;
  auVar36 = vdpps_avx(auVar52,auVar48,0x7f);
  auVar49 = vmulps_avx512vl(auVar52,auVar68);
  auVar50 = vbroadcastss_avx512vl(auVar35);
  auVar48 = vmulps_avx512vl(auVar50,auVar48);
  fVar168 = auVar36._0_4_;
  auVar54._0_4_ = fVar168 * auVar52._0_4_;
  auVar54._4_4_ = fVar168 * auVar52._4_4_;
  auVar54._8_4_ = fVar168 * auVar52._8_4_;
  auVar54._12_4_ = fVar168 * auVar52._12_4_;
  auVar52 = vsubps_avx(auVar48,auVar54);
  auVar36 = vrcp14ss_avx512f(auVar58,ZEXT416(auVar35._0_4_));
  auVar35 = vfnmadd213ss_avx512f(auVar35,auVar36,ZEXT416(0x40000000));
  fVar219 = auVar36._0_4_ * auVar35._0_4_;
  auVar35 = vdpps_avx(auVar51,auVar51,0x7f);
  auVar36 = vrsqrt14ss_avx512f(auVar58,ZEXT416(auVar35._0_4_));
  auVar48 = vmulss_avx512f(auVar36,ZEXT416(0x3fc00000));
  auVar50 = vmulss_avx512f(auVar35,ZEXT416(0xbf000000));
  fVar168 = auVar36._0_4_;
  fVar168 = auVar48._0_4_ + auVar50._0_4_ * fVar168 * fVar168 * fVar168;
  auVar69._0_4_ = auVar51._0_4_ * fVar168;
  auVar69._4_4_ = auVar51._4_4_ * fVar168;
  auVar69._8_4_ = auVar51._8_4_ * fVar168;
  auVar69._12_4_ = auVar51._12_4_ * fVar168;
  auVar36 = vdpps_avx(auVar51,auVar53,0x7f);
  auVar48 = vbroadcastss_avx512vl(auVar35);
  auVar48 = vmulps_avx512vl(auVar48,auVar53);
  fVar206 = auVar36._0_4_;
  auVar38._0_4_ = fVar206 * auVar51._0_4_;
  auVar38._4_4_ = fVar206 * auVar51._4_4_;
  auVar38._8_4_ = fVar206 * auVar51._8_4_;
  auVar38._12_4_ = fVar206 * auVar51._12_4_;
  auVar36 = vsubps_avx(auVar48,auVar38);
  auVar48 = vrcp14ss_avx512f(auVar58,ZEXT416(auVar35._0_4_));
  auVar35 = vfnmadd213ss_avx512f(auVar35,auVar48,ZEXT416(0x40000000));
  fVar206 = auVar48._0_4_ * auVar35._0_4_;
  auVar35 = vshufps_avx512vl(auVar43,auVar43,0xff);
  auVar48 = vmulps_avx512vl(auVar35,auVar49);
  auVar50 = vsubps_avx512vl(auVar43,auVar48);
  auVar51 = vshufps_avx512vl(auVar44,auVar44,0xff);
  auVar51 = vmulps_avx512vl(auVar51,auVar49);
  auVar45._0_4_ = auVar51._0_4_ + auVar35._0_4_ * fVar169 * fVar219 * auVar52._0_4_;
  auVar45._4_4_ = auVar51._4_4_ + auVar35._4_4_ * fVar169 * fVar219 * auVar52._4_4_;
  auVar45._8_4_ = auVar51._8_4_ + auVar35._8_4_ * fVar169 * fVar219 * auVar52._8_4_;
  auVar45._12_4_ = auVar51._12_4_ + auVar35._12_4_ * fVar169 * fVar219 * auVar52._12_4_;
  auVar52 = vsubps_avx512vl(auVar44,auVar45);
  auVar38 = vaddps_avx512vl(auVar43,auVar48);
  auVar48 = vaddps_avx512vl(auVar44,auVar45);
  auVar35 = vshufps_avx512vl(auVar47,auVar47,0xff);
  auVar51 = vmulps_avx512vl(auVar35,auVar69);
  auVar43 = vsubps_avx512vl(auVar47,auVar51);
  auVar53 = vshufps_avx512vl(auVar41,auVar41,0xff);
  auVar53 = vmulps_avx512vl(auVar53,auVar69);
  auVar70._0_4_ = auVar53._0_4_ + auVar35._0_4_ * fVar168 * auVar36._0_4_ * fVar206;
  auVar70._4_4_ = auVar53._4_4_ + auVar35._4_4_ * fVar168 * auVar36._4_4_ * fVar206;
  auVar70._8_4_ = auVar53._8_4_ + auVar35._8_4_ * fVar168 * auVar36._8_4_ * fVar206;
  auVar70._12_4_ = auVar53._12_4_ + auVar35._12_4_ * fVar168 * auVar36._12_4_ * fVar206;
  auVar35 = vsubps_avx(auVar41,auVar70);
  auVar44 = vaddps_avx512vl(auVar47,auVar51);
  auVar36 = vaddps_avx512vl(auVar41,auVar70);
  auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaab));
  auVar52 = vmulps_avx512vl(auVar52,auVar41);
  auVar64._0_4_ = auVar50._0_4_ + auVar52._0_4_;
  auVar64._4_4_ = auVar50._4_4_ + auVar52._4_4_;
  auVar64._8_4_ = auVar50._8_4_ + auVar52._8_4_;
  auVar64._12_4_ = auVar50._12_4_ + auVar52._12_4_;
  auVar35 = vmulps_avx512vl(auVar35,auVar41);
  auVar49 = vsubps_avx(auVar43,auVar35);
  auVar35 = vmulps_avx512vl(auVar48,auVar41);
  p00.field_0.v[1] = auVar38._4_4_ + auVar35._4_4_;
  p00.field_0.v[0] = auVar38._0_4_ + auVar35._0_4_;
  p00.field_0.v[2] = auVar38._8_4_ + auVar35._8_4_;
  p00.field_0.v[3] = auVar38._12_4_ + auVar35._12_4_;
  auVar35 = vmulps_avx512vl(auVar36,auVar41);
  auVar45 = vsubps_avx512vl(auVar44,auVar35);
  auVar35 = *(undefined1 (*) [16])(lVar11 + lVar10 * lVar2);
  auVar36 = vmulps_avx512vl(auVar135,auVar58);
  auVar52 = vfmadd213ps_avx512vl(auVar40,auVar57,auVar36);
  auVar52 = vfmadd231ps_avx512vl(auVar52,auVar56,auVar42);
  auVar46 = vfmadd231ps_avx512vl(auVar52,auVar55,auVar40);
  auVar36 = vfmadd231ps_avx512vl(auVar36,auVar57,auVar59);
  auVar36 = vfnmadd231ps_fma(auVar36,auVar56,auVar58);
  auVar47 = vfnmadd231ps_avx512vl(auVar36,auVar55,auVar59);
  auVar36 = vmulps_avx512vl(auVar35,auVar58);
  auVar52 = vfmadd213ps_avx512vl(auVar40,auVar67,auVar36);
  auVar52 = vfmadd231ps_avx512vl(auVar52,auVar66,auVar42);
  auVar52 = vfmadd231ps_avx512vl(auVar52,auVar77,auVar40);
  auVar36 = vfmadd231ps_avx512vl(auVar36,auVar67,auVar59);
  auVar36 = vfnmadd231ps_avx512vl(auVar36,auVar66,auVar58);
  auVar48 = vfnmadd231ps_avx512vl(auVar36,auVar77,auVar59);
  auVar36 = vmulps_avx512vl(auVar135,auVar40);
  auVar36 = vfmadd231ps_avx512vl(auVar36,auVar57,auVar42);
  auVar36 = vfmadd231ps_avx512vl(auVar36,auVar56,auVar40);
  auVar54 = vfmadd231ps_avx512vl(auVar36,auVar55,auVar58);
  auVar36 = vmulps_avx512vl(auVar135,auVar59);
  auVar36 = vfmadd231ps_avx512vl(auVar36,auVar58,auVar57);
  auVar36 = vfnmadd231ps_avx512vl(auVar36,auVar59,auVar56);
  auVar55 = vfnmadd231ps_avx512vl(auVar36,auVar58,auVar55);
  auVar36 = vmulps_avx512vl(auVar35,auVar40);
  auVar36 = vfmadd231ps_avx512vl(auVar36,auVar67,auVar42);
  auVar36 = vfmadd231ps_avx512vl(auVar36,auVar66,auVar40);
  auVar36 = vfmadd231ps_fma(auVar36,auVar77,auVar58);
  auVar35 = vmulps_avx512vl(auVar35,auVar59);
  auVar35 = vfmadd231ps_fma(auVar35,auVar58,auVar67);
  auVar35 = vfnmadd231ps_avx512vl(auVar35,auVar59,auVar66);
  auVar53 = vfnmadd231ps_fma(auVar35,auVar58,auVar77);
  auVar35 = vshufps_avx(auVar47,auVar47,0xc9);
  auVar51 = vshufps_avx512vl(auVar52,auVar52,0xc9);
  fVar206 = auVar47._0_4_;
  auVar88._0_4_ = fVar206 * auVar51._0_4_;
  fVar214 = auVar47._4_4_;
  auVar88._4_4_ = fVar214 * auVar51._4_4_;
  fVar215 = auVar47._8_4_;
  auVar88._8_4_ = fVar215 * auVar51._8_4_;
  fVar150 = auVar47._12_4_;
  auVar88._12_4_ = fVar150 * auVar51._12_4_;
  auVar52 = vfmsub231ps_avx512vl(auVar88,auVar35,auVar52);
  auVar52 = vshufps_avx(auVar52,auVar52,0xc9);
  auVar51 = vshufps_avx512vl(auVar48,auVar48,0xc9);
  auVar81._0_4_ = fVar206 * auVar51._0_4_;
  auVar81._4_4_ = fVar214 * auVar51._4_4_;
  auVar81._8_4_ = fVar215 * auVar51._8_4_;
  auVar81._12_4_ = fVar150 * auVar51._12_4_;
  auVar35 = vfmsub231ps_avx512vl(auVar81,auVar35,auVar48);
  auVar48 = vshufps_avx(auVar35,auVar35,0xc9);
  auVar56 = vshufps_avx512vl(auVar55,auVar55,0xc9);
  auVar35 = vshufps_avx(auVar36,auVar36,0xc9);
  auVar35 = vmulps_avx512vl(auVar55,auVar35);
  auVar35 = vfmsub231ps_fma(auVar35,auVar56,auVar36);
  auVar51 = vshufps_avx(auVar35,auVar35,0xc9);
  auVar36 = vshufps_avx(auVar53,auVar53,0xc9);
  auVar35 = vdpps_avx(auVar52,auVar52,0x7f);
  auVar36 = vmulps_avx512vl(auVar55,auVar36);
  auVar36 = vfmsub231ps_fma(auVar36,auVar56,auVar53);
  auVar53 = vshufps_avx(auVar36,auVar36,0xc9);
  auVar36 = vrsqrt14ss_avx512f(auVar58,ZEXT416(auVar35._0_4_));
  auVar56 = vmulss_avx512f(auVar36,ZEXT416(0x3fc00000));
  auVar57 = vmulss_avx512f(auVar35,ZEXT416(0xbf000000));
  auVar57 = vmulss_avx512f(auVar57,auVar36);
  auVar36 = vmulss_avx512f(auVar57,ZEXT416((uint)(auVar36._0_4_ * auVar36._0_4_)));
  auVar36 = vaddss_avx512f(auVar56,auVar36);
  auVar83._0_4_ = auVar36._0_4_;
  auVar83._4_4_ = auVar83._0_4_;
  auVar83._8_4_ = auVar83._0_4_;
  auVar83._12_4_ = auVar83._0_4_;
  auVar56 = vmulps_avx512vl(auVar52,auVar83);
  auVar36 = vdpps_avx(auVar52,auVar48,0x7f);
  auVar57 = vbroadcastss_avx512vl(auVar35);
  auVar48 = vmulps_avx512vl(auVar57,auVar48);
  fVar169 = auVar36._0_4_;
  auVar42._0_4_ = auVar52._0_4_ * fVar169;
  auVar42._4_4_ = auVar52._4_4_ * fVar169;
  auVar42._8_4_ = auVar52._8_4_ * fVar169;
  auVar42._12_4_ = auVar52._12_4_ * fVar169;
  auVar52 = vsubps_avx(auVar48,auVar42);
  auVar36 = vrcp14ss_avx512f(auVar58,ZEXT416(auVar35._0_4_));
  auVar35 = vfnmadd213ss_avx512f(auVar35,auVar36,ZEXT416(0x40000000));
  fVar168 = auVar36._0_4_ * auVar35._0_4_;
  auVar35 = vdpps_avx(auVar51,auVar51,0x7f);
  auVar36 = vrsqrt14ss_avx512f(auVar58,ZEXT416(auVar35._0_4_));
  auVar48 = vmulss_avx512f(auVar36,ZEXT416(0x3fc00000));
  auVar57 = vmulss_avx512f(auVar35,ZEXT416(0xbf000000));
  auVar42 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  fVar169 = auVar36._0_4_;
  fVar169 = auVar48._0_4_ + auVar57._0_4_ * fVar169 * fVar169 * fVar169;
  auVar89._0_4_ = auVar51._0_4_ * fVar169;
  auVar89._4_4_ = auVar51._4_4_ * fVar169;
  auVar89._8_4_ = auVar51._8_4_ * fVar169;
  auVar89._12_4_ = auVar51._12_4_ * fVar169;
  auVar36 = vdpps_avx(auVar51,auVar53,0x7f);
  auVar48 = vbroadcastss_avx512vl(auVar35);
  auVar48 = vmulps_avx512vl(auVar48,auVar53);
  fVar219 = auVar36._0_4_;
  auVar73._0_4_ = fVar219 * auVar51._0_4_;
  auVar73._4_4_ = fVar219 * auVar51._4_4_;
  auVar73._8_4_ = fVar219 * auVar51._8_4_;
  auVar73._12_4_ = fVar219 * auVar51._12_4_;
  auVar36 = vsubps_avx(auVar48,auVar73);
  auVar48 = vrcp14ss_avx512f(auVar58,ZEXT416(auVar35._0_4_));
  auVar35 = vfnmadd213ss_avx512f(auVar35,auVar48,ZEXT416(0x40000000));
  auVar247 = ZEXT464(0x3f800000);
  fVar219 = auVar35._0_4_ * auVar48._0_4_;
  auVar48 = vshufps_avx512vl(auVar46,auVar46,0xff);
  auVar51 = vmulps_avx512vl(auVar48,auVar56);
  auVar53 = vsubps_avx512vl(auVar46,auVar51);
  auVar35 = vshufps_avx(auVar47,auVar47,0xff);
  auVar35 = vmulps_avx512vl(auVar35,auVar56);
  auVar57._0_4_ = auVar35._0_4_ + auVar48._0_4_ * auVar83._0_4_ * fVar168 * auVar52._0_4_;
  auVar57._4_4_ = auVar35._4_4_ + auVar48._4_4_ * auVar83._0_4_ * fVar168 * auVar52._4_4_;
  auVar57._8_4_ = auVar35._8_4_ + auVar48._8_4_ * auVar83._0_4_ * fVar168 * auVar52._8_4_;
  auVar57._12_4_ = auVar35._12_4_ + auVar48._12_4_ * auVar83._0_4_ * fVar168 * auVar52._12_4_;
  auVar35 = vsubps_avx(auVar47,auVar57);
  auVar52 = vaddps_avx512vl(auVar46,auVar51);
  auVar47._0_4_ = fVar206 + auVar57._0_4_;
  auVar47._4_4_ = fVar214 + auVar57._4_4_;
  auVar47._8_4_ = fVar215 + auVar57._8_4_;
  auVar47._12_4_ = fVar150 + auVar57._12_4_;
  auVar48 = vshufps_avx512vl(auVar54,auVar54,0xff);
  auVar82._0_4_ = auVar48._0_4_ * auVar89._0_4_;
  auVar82._4_4_ = auVar48._4_4_ * auVar89._4_4_;
  auVar82._8_4_ = auVar48._8_4_ * auVar89._8_4_;
  auVar82._12_4_ = auVar48._12_4_ * auVar89._12_4_;
  auVar51 = vsubps_avx512vl(auVar54,auVar82);
  auVar56 = vshufps_avx512vl(auVar55,auVar55,0xff);
  auVar56 = vmulps_avx512vl(auVar56,auVar89);
  auVar62._0_4_ = auVar56._0_4_ + auVar48._0_4_ * fVar169 * auVar36._0_4_ * fVar219;
  auVar62._4_4_ = auVar56._4_4_ + auVar48._4_4_ * fVar169 * auVar36._4_4_ * fVar219;
  auVar62._8_4_ = auVar56._8_4_ + auVar48._8_4_ * fVar169 * auVar36._8_4_ * fVar219;
  auVar62._12_4_ = auVar56._12_4_ + auVar48._12_4_ * fVar169 * auVar36._12_4_ * fVar219;
  auVar36 = vsubps_avx512vl(auVar55,auVar62);
  auVar48 = vaddps_avx512vl(auVar54,auVar82);
  auVar55 = vaddps_avx512vl(auVar55,auVar62);
  auVar35 = vmulps_avx512vl(auVar35,auVar41);
  auVar74._0_4_ = auVar53._0_4_ + auVar35._0_4_;
  auVar74._4_4_ = auVar53._4_4_ + auVar35._4_4_;
  auVar74._8_4_ = auVar53._8_4_ + auVar35._8_4_;
  auVar74._12_4_ = auVar53._12_4_ + auVar35._12_4_;
  auVar35 = vmulps_avx512vl(auVar36,auVar41);
  auVar35 = vsubps_avx(auVar51,auVar35);
  auVar36 = vmulps_avx512vl(auVar47,auVar41);
  auVar59._0_4_ = auVar52._0_4_ + auVar36._0_4_;
  auVar59._4_4_ = auVar52._4_4_ + auVar36._4_4_;
  auVar59._8_4_ = auVar52._8_4_ + auVar36._8_4_;
  auVar59._12_4_ = auVar52._12_4_ + auVar36._12_4_;
  auVar36 = vmulps_avx512vl(auVar55,auVar41);
  auVar46 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar248 = ZEXT1664(auVar46);
  auVar36 = vsubps_avx(auVar48,auVar36);
  auVar55 = vbroadcastss_avx512vl(auVar39);
  auVar56 = vsubss_avx512f(ZEXT416(0x3f800000),auVar39);
  auVar135._0_4_ = auVar56._0_4_;
  auVar135._4_4_ = auVar135._0_4_;
  auVar135._8_4_ = auVar135._0_4_;
  auVar135._12_4_ = auVar135._0_4_;
  auVar53 = vmulps_avx512vl(auVar55,auVar53);
  auVar56 = vmulps_avx512vl(auVar55,auVar74);
  auVar35 = vmulps_avx512vl(auVar55,auVar35);
  auVar236._0_4_ = auVar55._0_4_ * auVar51._0_4_;
  auVar236._4_4_ = auVar55._4_4_ * auVar51._4_4_;
  auVar236._8_4_ = auVar55._8_4_ * auVar51._8_4_;
  auVar236._12_4_ = auVar55._12_4_ * auVar51._12_4_;
  auVar47 = vfmadd231ps_avx512vl(auVar53,auVar135,auVar50);
  auVar54 = vfmadd231ps_avx512vl(auVar56,auVar135,auVar64);
  auVar58 = vfmadd231ps_avx512vl(auVar35,auVar135,auVar49);
  auVar57 = vfmadd231ps_fma(auVar236,auVar135,auVar43);
  auVar35 = vmulps_avx512vl(auVar55,auVar52);
  auVar52 = vmulps_avx512vl(auVar55,auVar59);
  auVar36 = vmulps_avx512vl(auVar55,auVar36);
  auVar84._0_4_ = auVar55._0_4_ * auVar48._0_4_;
  auVar84._4_4_ = auVar55._4_4_ * auVar48._4_4_;
  auVar84._8_4_ = auVar55._8_4_ * auVar48._8_4_;
  auVar84._12_4_ = auVar55._12_4_ * auVar48._12_4_;
  auVar43 = vfmadd231ps_avx512vl(auVar35,auVar135,auVar38);
  auVar59 = vfmadd231ps_avx512vl(auVar52,auVar135,(undefined1  [16])p00.field_0);
  auVar45 = vfmadd231ps_avx512vl(auVar36,auVar135,auVar45);
  auVar135 = vfmadd231ps_fma(auVar84,auVar135,auVar44);
  auVar35 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar35 = vinsertps_avx(auVar35,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  fVar169 = *(float *)(ray + k * 4 + 0x30);
  auVar44 = vsubps_avx512vl(auVar47,auVar35);
  uVar134 = auVar44._0_4_;
  auVar77._4_4_ = uVar134;
  auVar77._0_4_ = uVar134;
  auVar77._8_4_ = uVar134;
  auVar77._12_4_ = uVar134;
  auVar36 = vshufps_avx(auVar44,auVar44,0x55);
  auVar52 = vshufps_avx(auVar44,auVar44,0xaa);
  aVar4 = pre->ray_space[k].vx.field_0;
  aVar5 = pre->ray_space[k].vy.field_0;
  fVar168 = pre->ray_space[k].vz.field_0.m128[0];
  fVar219 = pre->ray_space[k].vz.field_0.m128[1];
  fVar206 = pre->ray_space[k].vz.field_0.m128[2];
  fVar214 = pre->ray_space[k].vz.field_0.m128[3];
  auVar56._0_4_ = fVar168 * auVar52._0_4_;
  auVar56._4_4_ = fVar219 * auVar52._4_4_;
  auVar56._8_4_ = fVar206 * auVar52._8_4_;
  auVar56._12_4_ = fVar214 * auVar52._12_4_;
  auVar36 = vfmadd231ps_fma(auVar56,(undefined1  [16])aVar5,auVar36);
  auVar55 = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar4,auVar77);
  auVar60 = vsubps_avx512vl(auVar54,auVar35);
  uVar134 = auVar60._0_4_;
  auVar67._4_4_ = uVar134;
  auVar67._0_4_ = uVar134;
  auVar67._8_4_ = uVar134;
  auVar67._12_4_ = uVar134;
  auVar36 = vshufps_avx(auVar60,auVar60,0x55);
  auVar52 = vshufps_avx(auVar60,auVar60,0xaa);
  auVar66._0_4_ = fVar168 * auVar52._0_4_;
  auVar66._4_4_ = fVar219 * auVar52._4_4_;
  auVar66._8_4_ = fVar206 * auVar52._8_4_;
  auVar66._12_4_ = fVar214 * auVar52._12_4_;
  auVar36 = vfmadd231ps_fma(auVar66,(undefined1  [16])aVar5,auVar36);
  auVar77 = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar4,auVar67);
  auVar61 = vsubps_avx512vl(auVar58,auVar35);
  uVar134 = auVar61._0_4_;
  auVar39._4_4_ = uVar134;
  auVar39._0_4_ = uVar134;
  auVar39._8_4_ = uVar134;
  auVar39._12_4_ = uVar134;
  auVar36 = vshufps_avx(auVar61,auVar61,0x55);
  auVar52 = vshufps_avx(auVar61,auVar61,0xaa);
  auVar41._0_4_ = fVar168 * auVar52._0_4_;
  auVar41._4_4_ = fVar219 * auVar52._4_4_;
  auVar41._8_4_ = fVar206 * auVar52._8_4_;
  auVar41._12_4_ = fVar214 * auVar52._12_4_;
  auVar36 = vfmadd231ps_fma(auVar41,(undefined1  [16])aVar5,auVar36);
  auVar66 = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar4,auVar39);
  auVar49 = vsubps_avx(auVar57,auVar35);
  uVar134 = auVar49._0_4_;
  auVar71._4_4_ = uVar134;
  auVar71._0_4_ = uVar134;
  auVar71._8_4_ = uVar134;
  auVar71._12_4_ = uVar134;
  auVar36 = vshufps_avx(auVar49,auVar49,0x55);
  auVar52 = vshufps_avx(auVar49,auVar49,0xaa);
  auVar63._0_4_ = fVar168 * auVar52._0_4_;
  auVar63._4_4_ = fVar219 * auVar52._4_4_;
  auVar63._8_4_ = fVar206 * auVar52._8_4_;
  auVar63._12_4_ = fVar214 * auVar52._12_4_;
  auVar36 = vfmadd231ps_fma(auVar63,(undefined1  [16])aVar5,auVar36);
  auVar67 = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar4,auVar71);
  auVar62 = vsubps_avx512vl(auVar43,auVar35);
  uVar134 = auVar62._0_4_;
  auVar72._4_4_ = uVar134;
  auVar72._0_4_ = uVar134;
  auVar72._8_4_ = uVar134;
  auVar72._12_4_ = uVar134;
  auVar36 = vshufps_avx(auVar62,auVar62,0x55);
  auVar52 = vshufps_avx(auVar62,auVar62,0xaa);
  auVar75._0_4_ = auVar52._0_4_ * fVar168;
  auVar75._4_4_ = auVar52._4_4_ * fVar219;
  auVar75._8_4_ = auVar52._8_4_ * fVar206;
  auVar75._12_4_ = auVar52._12_4_ * fVar214;
  auVar36 = vfmadd231ps_fma(auVar75,(undefined1  [16])aVar5,auVar36);
  auVar38 = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar4,auVar72);
  auVar63 = vsubps_avx512vl(auVar59,auVar35);
  uVar134 = auVar63._0_4_;
  auVar184._4_4_ = uVar134;
  auVar184._0_4_ = uVar134;
  auVar184._8_4_ = uVar134;
  auVar184._12_4_ = uVar134;
  auVar36 = vshufps_avx(auVar63,auVar63,0x55);
  auVar52 = vshufps_avx(auVar63,auVar63,0xaa);
  auVar78._0_4_ = auVar52._0_4_ * fVar168;
  auVar78._4_4_ = auVar52._4_4_ * fVar219;
  auVar78._8_4_ = auVar52._8_4_ * fVar206;
  auVar78._12_4_ = auVar52._12_4_ * fVar214;
  auVar36 = vfmadd231ps_fma(auVar78,(undefined1  [16])aVar5,auVar36);
  auVar41 = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar4,auVar184);
  auVar64 = vsubps_avx512vl(auVar45,auVar35);
  uVar134 = auVar64._0_4_;
  auVar76._4_4_ = uVar134;
  auVar76._0_4_ = uVar134;
  auVar76._8_4_ = uVar134;
  auVar76._12_4_ = uVar134;
  auVar36 = vshufps_avx(auVar64,auVar64,0x55);
  auVar52 = vshufps_avx(auVar64,auVar64,0xaa);
  auVar85._0_4_ = auVar52._0_4_ * fVar168;
  auVar85._4_4_ = auVar52._4_4_ * fVar219;
  auVar85._8_4_ = auVar52._8_4_ * fVar206;
  auVar85._12_4_ = auVar52._12_4_ * fVar214;
  auVar36 = vfmadd231ps_fma(auVar85,(undefined1  [16])aVar5,auVar36);
  auVar39 = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar4,auVar76);
  auVar50 = vsubps_avx(auVar135,auVar35);
  uVar134 = auVar50._0_4_;
  auVar40._4_4_ = uVar134;
  auVar40._0_4_ = uVar134;
  auVar40._8_4_ = uVar134;
  auVar40._12_4_ = uVar134;
  auVar35 = vshufps_avx(auVar50,auVar50,0x55);
  auVar36 = vshufps_avx(auVar50,auVar50,0xaa);
  auVar65._0_4_ = auVar36._0_4_ * fVar168;
  auVar65._4_4_ = auVar36._4_4_ * fVar219;
  auVar65._8_4_ = auVar36._8_4_ * fVar206;
  auVar65._12_4_ = auVar36._12_4_ * fVar214;
  auVar35 = vfmadd231ps_fma(auVar65,(undefined1  [16])aVar5,auVar35);
  auVar40 = vfmadd231ps_fma(auVar35,(undefined1  [16])aVar4,auVar40);
  auVar52 = vmovlhps_avx(auVar55,auVar38);
  auVar48 = vmovlhps_avx(auVar77,auVar41);
  auVar51 = vmovlhps_avx(auVar66,auVar39);
  auVar56 = vmovlhps_avx512f(auVar67,auVar40);
  auVar36 = vminps_avx(auVar52,auVar48);
  auVar35 = vmaxps_avx(auVar52,auVar48);
  auVar53 = vminps_avx512vl(auVar51,auVar56);
  auVar36 = vminps_avx(auVar36,auVar53);
  auVar53 = vmaxps_avx512vl(auVar51,auVar56);
  auVar35 = vmaxps_avx(auVar35,auVar53);
  auVar53 = vshufpd_avx(auVar36,auVar36,3);
  auVar36 = vminps_avx(auVar36,auVar53);
  auVar53 = vshufpd_avx(auVar35,auVar35,3);
  auVar35 = vmaxps_avx(auVar35,auVar53);
  auVar36 = vandps_avx512vl(auVar36,auVar46);
  auVar35 = vandps_avx512vl(auVar35,auVar46);
  auVar35 = vmaxps_avx(auVar36,auVar35);
  auVar36 = vmovshdup_avx(auVar35);
  auVar35 = vmaxss_avx(auVar36,auVar35);
  fVar168 = auVar35._0_4_ * 9.536743e-07;
  auVar46 = vmovddup_avx512vl(auVar55);
  auVar65 = vmovddup_avx512vl(auVar77);
  auVar66 = vmovddup_avx512vl(auVar66);
  auVar67 = vmovddup_avx512vl(auVar67);
  auVar105 = vbroadcastss_avx512vl(ZEXT416((uint)fVar168));
  auVar35 = vxorps_avx512vl(auVar105._0_16_,auVar42);
  auVar106 = vbroadcastss_avx512vl(auVar35);
  uVar23 = 0;
  auVar35 = vsubps_avx(auVar48,auVar52);
  auVar36 = vsubps_avx(auVar51,auVar48);
  auVar42 = vsubps_avx512vl(auVar56,auVar51);
  auVar68 = vsubps_avx512vl(auVar43,auVar47);
  auVar69 = vsubps_avx512vl(auVar59,auVar54);
  auVar70 = vsubps_avx512vl(auVar45,auVar58);
  auVar53 = vsubps_avx(auVar135,auVar57);
  auVar71 = vpbroadcastd_avx512vl();
  auVar72 = vpbroadcastd_avx512vl();
  auVar77 = ZEXT816(0x3f80000000000000);
  auVar55 = auVar77;
LAB_01b4c4d7:
  do {
    auVar184 = vshufps_avx(auVar55,auVar55,0x50);
    auVar232._8_4_ = 0x3f800000;
    auVar232._0_8_ = 0x3f8000003f800000;
    auVar232._12_4_ = 0x3f800000;
    auVar235._16_4_ = 0x3f800000;
    auVar235._0_16_ = auVar232;
    auVar235._20_4_ = 0x3f800000;
    auVar235._24_4_ = 0x3f800000;
    auVar235._28_4_ = 0x3f800000;
    auVar76 = vsubps_avx(auVar232,auVar184);
    fVar219 = auVar184._0_4_;
    fVar150 = auVar38._0_4_;
    auVar80._0_4_ = fVar150 * fVar219;
    fVar206 = auVar184._4_4_;
    fVar155 = auVar38._4_4_;
    auVar80._4_4_ = fVar155 * fVar206;
    fVar214 = auVar184._8_4_;
    auVar80._8_4_ = fVar150 * fVar214;
    fVar215 = auVar184._12_4_;
    auVar80._12_4_ = fVar155 * fVar215;
    fVar159 = auVar41._0_4_;
    auVar86._0_4_ = fVar159 * fVar219;
    fVar167 = auVar41._4_4_;
    auVar86._4_4_ = fVar167 * fVar206;
    auVar86._8_4_ = fVar159 * fVar214;
    auVar86._12_4_ = fVar167 * fVar215;
    fVar170 = auVar39._0_4_;
    auVar87._0_4_ = fVar170 * fVar219;
    fVar176 = auVar39._4_4_;
    auVar87._4_4_ = fVar176 * fVar206;
    auVar87._8_4_ = fVar170 * fVar214;
    auVar87._12_4_ = fVar176 * fVar215;
    fVar177 = auVar40._0_4_;
    auVar79._0_4_ = fVar177 * fVar219;
    fVar183 = auVar40._4_4_;
    auVar79._4_4_ = fVar183 * fVar206;
    auVar79._8_4_ = fVar177 * fVar214;
    auVar79._12_4_ = fVar183 * fVar215;
    auVar73 = vfmadd231ps_avx512vl(auVar80,auVar76,auVar46);
    auVar74 = vfmadd231ps_avx512vl(auVar86,auVar76,auVar65);
    auVar75 = vfmadd231ps_avx512vl(auVar87,auVar76,auVar66);
    auVar76 = vfmadd231ps_avx512vl(auVar79,auVar67,auVar76);
    auVar184 = vmovshdup_avx(auVar77);
    fVar206 = auVar77._0_4_;
    fVar219 = (auVar184._0_4_ - fVar206) * 0.04761905;
    auVar189._4_4_ = fVar206;
    auVar189._0_4_ = fVar206;
    auVar189._8_4_ = fVar206;
    auVar189._12_4_ = fVar206;
    auVar189._16_4_ = fVar206;
    auVar189._20_4_ = fVar206;
    auVar189._24_4_ = fVar206;
    auVar189._28_4_ = fVar206;
    auVar148._0_8_ = auVar184._0_8_;
    auVar148._8_8_ = auVar148._0_8_;
    auVar148._16_8_ = auVar148._0_8_;
    auVar148._24_8_ = auVar148._0_8_;
    auVar103 = vsubps_avx(auVar148,auVar189);
    uVar134 = auVar73._0_4_;
    auVar149._4_4_ = uVar134;
    auVar149._0_4_ = uVar134;
    auVar149._8_4_ = uVar134;
    auVar149._12_4_ = uVar134;
    auVar149._16_4_ = uVar134;
    auVar149._20_4_ = uVar134;
    auVar149._24_4_ = uVar134;
    auVar149._28_4_ = uVar134;
    auVar203._8_4_ = 1;
    auVar203._0_8_ = 0x100000001;
    auVar203._12_4_ = 1;
    auVar203._16_4_ = 1;
    auVar203._20_4_ = 1;
    auVar203._24_4_ = 1;
    auVar203._28_4_ = 1;
    auVar104 = ZEXT1632(auVar73);
    auVar95 = vpermps_avx2(auVar203,auVar104);
    auVar96 = vbroadcastss_avx512vl(auVar74);
    auVar114 = ZEXT1632(auVar74);
    auVar97 = vpermps_avx512vl(auVar203,auVar114);
    auVar107 = vbroadcastss_avx512vl(auVar75);
    auVar90 = ZEXT1632(auVar75);
    auVar108 = vpermps_avx512vl(auVar203,auVar90);
    auVar109 = vbroadcastss_avx512vl(auVar76);
    auVar113 = ZEXT1632(auVar76);
    auVar110 = vpermps_avx512vl(auVar203,auVar113);
    auVar204._4_4_ = fVar219;
    auVar204._0_4_ = fVar219;
    auVar204._8_4_ = fVar219;
    auVar204._12_4_ = fVar219;
    auVar204._16_4_ = fVar219;
    auVar204._20_4_ = fVar219;
    auVar204._24_4_ = fVar219;
    auVar204._28_4_ = fVar219;
    auVar182._8_4_ = 2;
    auVar182._0_8_ = 0x200000002;
    auVar182._12_4_ = 2;
    auVar182._16_4_ = 2;
    auVar182._20_4_ = 2;
    auVar182._24_4_ = 2;
    auVar182._28_4_ = 2;
    auVar111 = vpermps_avx512vl(auVar182,auVar104);
    auVar112 = vbroadcastss_avx512vl(ZEXT416(3));
    auVar91 = vpermps_avx512vl(auVar112,auVar104);
    auVar92 = vpermps_avx512vl(auVar182,auVar114);
    auVar93 = vpermps_avx512vl(auVar112,auVar114);
    auVar104 = vpermps_avx2(auVar182,auVar90);
    auVar94 = vpermps_avx512vl(auVar112,auVar90);
    auVar98 = vpermps_avx512vl(auVar182,auVar113);
    auVar99 = vpermps_avx512vl(auVar112,auVar113);
    auVar184 = vfmadd132ps_fma(auVar103,auVar189,_DAT_01f7b040);
    auVar103 = vsubps_avx(auVar235,ZEXT1632(auVar184));
    auVar112 = vmulps_avx512vl(auVar96,ZEXT1632(auVar184));
    auVar114 = ZEXT1632(auVar184);
    auVar113 = vmulps_avx512vl(auVar97,auVar114);
    auVar76 = vfmadd231ps_fma(auVar112,auVar103,auVar149);
    auVar73 = vfmadd231ps_fma(auVar113,auVar103,auVar95);
    auVar112 = vmulps_avx512vl(auVar107,auVar114);
    auVar113 = vmulps_avx512vl(auVar108,auVar114);
    auVar96 = vfmadd231ps_avx512vl(auVar112,auVar103,auVar96);
    auVar97 = vfmadd231ps_avx512vl(auVar113,auVar103,auVar97);
    auVar112 = vmulps_avx512vl(auVar109,auVar114);
    auVar100 = ZEXT1632(auVar184);
    auVar110 = vmulps_avx512vl(auVar110,auVar100);
    auVar107 = vfmadd231ps_avx512vl(auVar112,auVar103,auVar107);
    auVar108 = vfmadd231ps_avx512vl(auVar110,auVar103,auVar108);
    fVar214 = auVar184._0_4_;
    fVar215 = auVar184._4_4_;
    auVar112._4_4_ = fVar215 * auVar96._4_4_;
    auVar112._0_4_ = fVar214 * auVar96._0_4_;
    fVar216 = auVar184._8_4_;
    auVar112._8_4_ = fVar216 * auVar96._8_4_;
    fVar217 = auVar184._12_4_;
    auVar112._12_4_ = fVar217 * auVar96._12_4_;
    auVar112._16_4_ = auVar96._16_4_ * 0.0;
    auVar112._20_4_ = auVar96._20_4_ * 0.0;
    auVar112._24_4_ = auVar96._24_4_ * 0.0;
    auVar112._28_4_ = fVar206;
    auVar113._4_4_ = fVar215 * auVar97._4_4_;
    auVar113._0_4_ = fVar214 * auVar97._0_4_;
    auVar113._8_4_ = fVar216 * auVar97._8_4_;
    auVar113._12_4_ = fVar217 * auVar97._12_4_;
    auVar113._16_4_ = auVar97._16_4_ * 0.0;
    auVar113._20_4_ = auVar97._20_4_ * 0.0;
    auVar113._24_4_ = auVar97._24_4_ * 0.0;
    auVar113._28_4_ = auVar95._28_4_;
    auVar76 = vfmadd231ps_fma(auVar112,auVar103,ZEXT1632(auVar76));
    auVar73 = vfmadd231ps_fma(auVar113,auVar103,ZEXT1632(auVar73));
    auVar101._0_4_ = fVar214 * auVar107._0_4_;
    auVar101._4_4_ = fVar215 * auVar107._4_4_;
    auVar101._8_4_ = fVar216 * auVar107._8_4_;
    auVar101._12_4_ = fVar217 * auVar107._12_4_;
    auVar101._16_4_ = auVar107._16_4_ * 0.0;
    auVar101._20_4_ = auVar107._20_4_ * 0.0;
    auVar101._24_4_ = auVar107._24_4_ * 0.0;
    auVar101._28_4_ = 0;
    auVar114._4_4_ = fVar215 * auVar108._4_4_;
    auVar114._0_4_ = fVar214 * auVar108._0_4_;
    auVar114._8_4_ = fVar216 * auVar108._8_4_;
    auVar114._12_4_ = fVar217 * auVar108._12_4_;
    auVar114._16_4_ = auVar108._16_4_ * 0.0;
    auVar114._20_4_ = auVar108._20_4_ * 0.0;
    auVar114._24_4_ = auVar108._24_4_ * 0.0;
    auVar114._28_4_ = auVar107._28_4_;
    auVar74 = vfmadd231ps_fma(auVar101,auVar103,auVar96);
    auVar75 = vfmadd231ps_fma(auVar114,auVar103,auVar97);
    auVar90._28_4_ = auVar97._28_4_;
    auVar90._0_28_ =
         ZEXT1628(CONCAT412(fVar217 * auVar75._12_4_,
                            CONCAT48(fVar216 * auVar75._8_4_,
                                     CONCAT44(fVar215 * auVar75._4_4_,fVar214 * auVar75._0_4_))));
    auVar78 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar217 * auVar74._12_4_,
                                                 CONCAT48(fVar216 * auVar74._8_4_,
                                                          CONCAT44(fVar215 * auVar74._4_4_,
                                                                   fVar214 * auVar74._0_4_)))),
                              auVar103,ZEXT1632(auVar76));
    auVar88 = vfmadd231ps_fma(auVar90,auVar103,ZEXT1632(auVar73));
    auVar95 = vsubps_avx(ZEXT1632(auVar74),ZEXT1632(auVar76));
    auVar96 = vsubps_avx(ZEXT1632(auVar75),ZEXT1632(auVar73));
    auVar97 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar95 = vmulps_avx512vl(auVar95,auVar97);
    auVar96 = vmulps_avx512vl(auVar96,auVar97);
    auVar198._0_4_ = fVar219 * auVar95._0_4_;
    auVar198._4_4_ = fVar219 * auVar95._4_4_;
    auVar198._8_4_ = fVar219 * auVar95._8_4_;
    auVar198._12_4_ = fVar219 * auVar95._12_4_;
    auVar198._16_4_ = fVar219 * auVar95._16_4_;
    auVar198._20_4_ = fVar219 * auVar95._20_4_;
    auVar198._24_4_ = fVar219 * auVar95._24_4_;
    auVar198._28_4_ = 0;
    auVar95 = vmulps_avx512vl(auVar204,auVar96);
    auVar73 = vxorps_avx512vl(auVar109._0_16_,auVar109._0_16_);
    auVar96 = vpermt2ps_avx512vl(ZEXT1632(auVar78),_DAT_01fb9fc0,ZEXT1632(auVar73));
    auVar107 = vpermt2ps_avx512vl(ZEXT1632(auVar88),_DAT_01fb9fc0,ZEXT1632(auVar73));
    auVar102._0_4_ = auVar198._0_4_ + auVar78._0_4_;
    auVar102._4_4_ = auVar198._4_4_ + auVar78._4_4_;
    auVar102._8_4_ = auVar198._8_4_ + auVar78._8_4_;
    auVar102._12_4_ = auVar198._12_4_ + auVar78._12_4_;
    auVar102._16_4_ = auVar198._16_4_ + 0.0;
    auVar102._20_4_ = auVar198._20_4_ + 0.0;
    auVar102._24_4_ = auVar198._24_4_ + 0.0;
    auVar102._28_4_ = 0;
    auVar101 = ZEXT1632(auVar73);
    auVar108 = vpermt2ps_avx512vl(auVar198,_DAT_01fb9fc0,auVar101);
    auVar109 = vaddps_avx512vl(ZEXT1632(auVar88),auVar95);
    auVar110 = vpermt2ps_avx512vl(auVar95,_DAT_01fb9fc0,auVar101);
    auVar95 = vsubps_avx(auVar96,auVar108);
    auVar108 = vsubps_avx512vl(auVar107,auVar110);
    auVar110 = vmulps_avx512vl(auVar92,auVar100);
    auVar112 = vmulps_avx512vl(auVar93,auVar100);
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar103,auVar111);
    auVar111 = vfmadd231ps_avx512vl(auVar112,auVar103,auVar91);
    auVar112 = vmulps_avx512vl(auVar104,auVar100);
    auVar113 = vmulps_avx512vl(auVar94,auVar100);
    auVar112 = vfmadd231ps_avx512vl(auVar112,auVar103,auVar92);
    auVar113 = vfmadd231ps_avx512vl(auVar113,auVar103,auVar93);
    auVar114 = vmulps_avx512vl(auVar98,auVar100);
    auVar90 = vmulps_avx512vl(auVar99,auVar100);
    auVar76 = vfmadd231ps_fma(auVar114,auVar103,auVar104);
    auVar104 = vfmadd231ps_avx512vl(auVar90,auVar103,auVar94);
    auVar114 = vmulps_avx512vl(auVar100,auVar112);
    auVar92 = ZEXT1632(auVar184);
    auVar90 = vmulps_avx512vl(auVar92,auVar113);
    auVar110 = vfmadd231ps_avx512vl(auVar114,auVar103,auVar110);
    auVar111 = vfmadd231ps_avx512vl(auVar90,auVar103,auVar111);
    auVar104 = vmulps_avx512vl(auVar92,auVar104);
    auVar112 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(fVar217 * auVar76._12_4_,
                                             CONCAT48(fVar216 * auVar76._8_4_,
                                                      CONCAT44(fVar215 * auVar76._4_4_,
                                                               fVar214 * auVar76._0_4_)))),auVar103,
                          auVar112);
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar103,auVar113);
    auVar91._4_4_ = fVar215 * auVar112._4_4_;
    auVar91._0_4_ = fVar214 * auVar112._0_4_;
    auVar91._8_4_ = fVar216 * auVar112._8_4_;
    auVar91._12_4_ = fVar217 * auVar112._12_4_;
    auVar91._16_4_ = auVar112._16_4_ * 0.0;
    auVar91._20_4_ = auVar112._20_4_ * 0.0;
    auVar91._24_4_ = auVar112._24_4_ * 0.0;
    auVar91._28_4_ = auVar94._28_4_;
    auVar113 = vmulps_avx512vl(auVar92,auVar104);
    auVar114 = vfmadd231ps_avx512vl(auVar91,auVar103,auVar110);
    auVar113 = vfmadd231ps_avx512vl(auVar113,auVar111,auVar103);
    auVar103 = vsubps_avx512vl(auVar112,auVar110);
    auVar104 = vsubps_avx512vl(auVar104,auVar111);
    auVar103 = vmulps_avx512vl(auVar103,auVar97);
    auVar104 = vmulps_avx512vl(auVar104,auVar97);
    fVar206 = fVar219 * auVar103._0_4_;
    fVar214 = fVar219 * auVar103._4_4_;
    auVar100._4_4_ = fVar214;
    auVar100._0_4_ = fVar206;
    fVar215 = fVar219 * auVar103._8_4_;
    auVar100._8_4_ = fVar215;
    fVar216 = fVar219 * auVar103._12_4_;
    auVar100._12_4_ = fVar216;
    fVar217 = fVar219 * auVar103._16_4_;
    auVar100._16_4_ = fVar217;
    fVar218 = fVar219 * auVar103._20_4_;
    auVar100._20_4_ = fVar218;
    fVar219 = fVar219 * auVar103._24_4_;
    auVar100._24_4_ = fVar219;
    auVar100._28_4_ = auVar103._28_4_;
    auVar104 = vmulps_avx512vl(auVar204,auVar104);
    auVar97 = vpermt2ps_avx512vl(auVar114,_DAT_01fb9fc0,auVar101);
    auVar110 = vpermt2ps_avx512vl(auVar113,_DAT_01fb9fc0,auVar101);
    auVar205._0_4_ = auVar114._0_4_ + fVar206;
    auVar205._4_4_ = auVar114._4_4_ + fVar214;
    auVar205._8_4_ = auVar114._8_4_ + fVar215;
    auVar205._12_4_ = auVar114._12_4_ + fVar216;
    auVar205._16_4_ = auVar114._16_4_ + fVar217;
    auVar205._20_4_ = auVar114._20_4_ + fVar218;
    auVar205._24_4_ = auVar114._24_4_ + fVar219;
    auVar205._28_4_ = auVar114._28_4_ + auVar103._28_4_;
    auVar103 = vpermt2ps_avx512vl(auVar100,_DAT_01fb9fc0,ZEXT1632(auVar73));
    auVar111 = vaddps_avx512vl(auVar113,auVar104);
    auVar104 = vpermt2ps_avx512vl(auVar104,_DAT_01fb9fc0,ZEXT1632(auVar73));
    auVar103 = vsubps_avx(auVar97,auVar103);
    auVar104 = vsubps_avx512vl(auVar110,auVar104);
    auVar101 = ZEXT1632(auVar78);
    auVar112 = vsubps_avx512vl(auVar114,auVar101);
    auVar148 = ZEXT1632(auVar88);
    auVar90 = vsubps_avx512vl(auVar113,auVar148);
    auVar91 = vsubps_avx512vl(auVar97,auVar96);
    auVar112 = vaddps_avx512vl(auVar112,auVar91);
    auVar91 = vsubps_avx512vl(auVar110,auVar107);
    auVar90 = vaddps_avx512vl(auVar90,auVar91);
    auVar91 = vmulps_avx512vl(auVar148,auVar112);
    auVar91 = vfnmadd231ps_avx512vl(auVar91,auVar101,auVar90);
    auVar92 = vmulps_avx512vl(auVar109,auVar112);
    auVar92 = vfnmadd231ps_avx512vl(auVar92,auVar102,auVar90);
    auVar93 = vmulps_avx512vl(auVar108,auVar112);
    auVar93 = vfnmadd231ps_avx512vl(auVar93,auVar95,auVar90);
    auVar94 = vmulps_avx512vl(auVar107,auVar112);
    auVar94 = vfnmadd231ps_avx512vl(auVar94,auVar96,auVar90);
    auVar98 = vmulps_avx512vl(auVar113,auVar112);
    auVar98 = vfnmadd231ps_avx512vl(auVar98,auVar114,auVar90);
    auVar99 = vmulps_avx512vl(auVar111,auVar112);
    auVar99 = vfnmadd231ps_avx512vl(auVar99,auVar205,auVar90);
    auVar100 = vmulps_avx512vl(auVar104,auVar112);
    auVar100 = vfnmadd231ps_avx512vl(auVar100,auVar103,auVar90);
    auVar112 = vmulps_avx512vl(auVar110,auVar112);
    auVar112 = vfnmadd231ps_avx512vl(auVar112,auVar97,auVar90);
    auVar90 = vminps_avx512vl(auVar91,auVar92);
    auVar91 = vmaxps_avx512vl(auVar91,auVar92);
    auVar92 = vminps_avx512vl(auVar93,auVar94);
    auVar90 = vminps_avx512vl(auVar90,auVar92);
    auVar92 = vmaxps_avx512vl(auVar93,auVar94);
    auVar91 = vmaxps_avx512vl(auVar91,auVar92);
    auVar92 = vminps_avx512vl(auVar98,auVar99);
    auVar93 = vmaxps_avx512vl(auVar98,auVar99);
    auVar94 = vminps_avx512vl(auVar100,auVar112);
    auVar92 = vminps_avx512vl(auVar92,auVar94);
    auVar90 = vminps_avx512vl(auVar90,auVar92);
    auVar112 = vmaxps_avx512vl(auVar100,auVar112);
    auVar112 = vmaxps_avx512vl(auVar93,auVar112);
    auVar112 = vmaxps_avx512vl(auVar91,auVar112);
    auVar184 = auVar112._0_16_;
    uVar14 = vcmpps_avx512vl(auVar90,auVar105,2);
    uVar15 = vcmpps_avx512vl(auVar112,auVar106,5);
    bVar20 = (byte)uVar14 & (byte)uVar15 & 0x7f;
    if (bVar20 != 0) {
      auVar112 = vsubps_avx512vl(auVar96,auVar101);
      auVar90 = vsubps_avx512vl(auVar107,auVar148);
      auVar91 = vsubps_avx512vl(auVar97,auVar114);
      auVar112 = vaddps_avx512vl(auVar112,auVar91);
      auVar184 = auVar112._0_16_;
      auVar91 = vsubps_avx512vl(auVar110,auVar113);
      auVar90 = vaddps_avx512vl(auVar90,auVar91);
      auVar91 = vmulps_avx512vl(auVar148,auVar112);
      auVar91 = vfnmadd231ps_avx512vl(auVar91,auVar90,auVar101);
      auVar109 = vmulps_avx512vl(auVar109,auVar112);
      auVar109 = vfnmadd213ps_avx512vl(auVar102,auVar90,auVar109);
      auVar108 = vmulps_avx512vl(auVar108,auVar112);
      auVar108 = vfnmadd213ps_avx512vl(auVar95,auVar90,auVar108);
      auVar95 = vmulps_avx512vl(auVar107,auVar112);
      auVar107 = vfnmadd231ps_avx512vl(auVar95,auVar90,auVar96);
      auVar95 = vmulps_avx512vl(auVar113,auVar112);
      auVar113 = vfnmadd231ps_avx512vl(auVar95,auVar90,auVar114);
      auVar95 = vmulps_avx512vl(auVar111,auVar112);
      auVar111 = vfnmadd213ps_avx512vl(auVar205,auVar90,auVar95);
      auVar95 = vmulps_avx512vl(auVar104,auVar112);
      auVar114 = vfnmadd213ps_avx512vl(auVar103,auVar90,auVar95);
      auVar103 = vmulps_avx512vl(auVar110,auVar112);
      auVar110 = vfnmadd231ps_avx512vl(auVar103,auVar97,auVar90);
      auVar95 = vminps_avx(auVar91,auVar109);
      auVar103 = vmaxps_avx(auVar91,auVar109);
      auVar96 = vminps_avx(auVar108,auVar107);
      auVar96 = vminps_avx(auVar95,auVar96);
      auVar95 = vmaxps_avx(auVar108,auVar107);
      auVar103 = vmaxps_avx(auVar103,auVar95);
      auVar104 = vminps_avx(auVar113,auVar111);
      auVar95 = vmaxps_avx(auVar113,auVar111);
      auVar97 = vminps_avx(auVar114,auVar110);
      auVar104 = vminps_avx(auVar104,auVar97);
      auVar104 = vminps_avx(auVar96,auVar104);
      auVar96 = vmaxps_avx(auVar114,auVar110);
      auVar95 = vmaxps_avx(auVar95,auVar96);
      auVar103 = vmaxps_avx(auVar103,auVar95);
      uVar14 = vcmpps_avx512vl(auVar103,auVar106,5);
      uVar15 = vcmpps_avx512vl(auVar104,auVar105,2);
      bVar20 = bVar20 & (byte)uVar14 & (byte)uVar15;
      if (bVar20 != 0) {
        mask_stack[uVar23] = (uint)bVar20;
        BVar3 = (BBox1f)vmovlps_avx(auVar77);
        cu_stack[uVar23] = BVar3;
        BVar3 = (BBox1f)vmovlps_avx(auVar55);
        cv_stack[uVar23] = BVar3;
        uVar23 = (ulong)((int)uVar23 + 1);
      }
    }
    auVar55 = vxorps_avx512vl(auVar184,auVar184);
    auVar242 = ZEXT1664(auVar55);
    auVar55 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar250 = ZEXT1664(auVar55);
    auVar103 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar243 = ZEXT3264(auVar103);
    auVar55 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
    auVar244 = ZEXT1664(auVar55);
    auVar55 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar245 = ZEXT1664(auVar55);
    auVar246 = ZEXT3264(_DAT_01fb9fe0);
    auVar55 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar249 = ZEXT1664(auVar55);
LAB_01b4c9d3:
    do {
      do {
        do {
          auVar184 = auVar242._0_16_;
          if ((int)uVar23 == 0) {
            uVar134 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar19._4_4_ = uVar134;
            auVar19._0_4_ = uVar134;
            auVar19._8_4_ = uVar134;
            auVar19._12_4_ = uVar134;
            auVar19._16_4_ = uVar134;
            auVar19._20_4_ = uVar134;
            auVar19._24_4_ = uVar134;
            auVar19._28_4_ = uVar134;
            uVar14 = vcmpps_avx512vl(local_78,auVar19,2);
            uVar28 = (ulong)((uint)uVar28 & (uint)uVar28 + 0xff & (uint)uVar14);
            goto LAB_01b4b986;
          }
          uVar21 = (int)uVar23 - 1;
          uVar7 = mask_stack[uVar21];
          auVar55._8_8_ = 0;
          auVar55._0_4_ = cv_stack[uVar21].lower;
          auVar55._4_4_ = cv_stack[uVar21].upper;
          uVar33 = 0;
          for (uVar27 = (ulong)uVar7; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x8000000000000000)
          {
            uVar33 = uVar33 + 1;
          }
          uVar24 = uVar7 - 1 & uVar7;
          bVar31 = uVar24 == 0;
          mask_stack[uVar21] = uVar24;
          if (bVar31) {
            uVar23 = (ulong)uVar21;
          }
          auVar136._8_8_ = 0;
          auVar136._0_8_ = uVar33;
          auVar77 = vpunpcklqdq_avx(auVar136,ZEXT416((int)uVar33 + 1));
          auVar77 = vcvtqq2ps_avx512vl(auVar77);
          auVar77 = vmulps_avx512vl(auVar77,auVar244._0_16_);
          fVar219 = cu_stack[uVar21].upper;
          auVar16._4_4_ = fVar219;
          auVar16._0_4_ = fVar219;
          auVar16._8_4_ = fVar219;
          auVar16._12_4_ = fVar219;
          auVar76 = vmulps_avx512vl(auVar77,auVar16);
          auVar73 = auVar245._0_16_;
          auVar77 = vsubps_avx512vl(auVar73,auVar77);
          fVar219 = cu_stack[uVar21].lower;
          auVar17._4_4_ = fVar219;
          auVar17._0_4_ = fVar219;
          auVar17._8_4_ = fVar219;
          auVar17._12_4_ = fVar219;
          auVar77 = vfmadd231ps_avx512vl(auVar76,auVar77,auVar17);
          auVar76 = vmovshdup_avx(auVar77);
          fVar219 = auVar76._0_4_ - auVar77._0_4_;
          vucomiss_avx512f(ZEXT416((uint)fVar219));
          if (uVar7 == 0 || bVar31) goto LAB_01b4c4d7;
          auVar76 = vshufps_avx(auVar55,auVar55,0x50);
          vucomiss_avx512f(ZEXT416((uint)fVar219));
          auVar78 = vsubps_avx512vl(auVar73,auVar76);
          fVar206 = auVar76._0_4_;
          auVar160._0_4_ = fVar206 * fVar150;
          fVar214 = auVar76._4_4_;
          auVar160._4_4_ = fVar214 * fVar155;
          fVar215 = auVar76._8_4_;
          auVar160._8_4_ = fVar215 * fVar150;
          fVar216 = auVar76._12_4_;
          auVar160._12_4_ = fVar216 * fVar155;
          auVar171._0_4_ = fVar206 * fVar159;
          auVar171._4_4_ = fVar214 * fVar167;
          auVar171._8_4_ = fVar215 * fVar159;
          auVar171._12_4_ = fVar216 * fVar167;
          auVar178._0_4_ = fVar206 * fVar170;
          auVar178._4_4_ = fVar214 * fVar176;
          auVar178._8_4_ = fVar215 * fVar170;
          auVar178._12_4_ = fVar216 * fVar176;
          auVar143._0_4_ = fVar206 * fVar177;
          auVar143._4_4_ = fVar214 * fVar183;
          auVar143._8_4_ = fVar215 * fVar177;
          auVar143._12_4_ = fVar216 * fVar183;
          auVar76 = vfmadd231ps_fma(auVar160,auVar78,auVar46);
          auVar74 = vfmadd231ps_fma(auVar171,auVar78,auVar65);
          auVar75 = vfmadd231ps_fma(auVar178,auVar78,auVar66);
          auVar78 = vfmadd231ps_fma(auVar143,auVar78,auVar67);
          auVar154._16_16_ = auVar76;
          auVar154._0_16_ = auVar76;
          auVar165._16_16_ = auVar74;
          auVar165._0_16_ = auVar74;
          auVar175._16_16_ = auVar75;
          auVar175._0_16_ = auVar75;
          auVar95 = vpermps_avx512vl(auVar246._0_32_,ZEXT1632(auVar77));
          auVar103 = vsubps_avx(auVar165,auVar154);
          auVar74 = vfmadd213ps_fma(auVar103,auVar95,auVar154);
          auVar103 = vsubps_avx(auVar175,auVar165);
          auVar88 = vfmadd213ps_fma(auVar103,auVar95,auVar165);
          auVar76 = vsubps_avx(auVar78,auVar75);
          auVar166._16_16_ = auVar76;
          auVar166._0_16_ = auVar76;
          auVar76 = vfmadd213ps_fma(auVar166,auVar95,auVar175);
          auVar103 = vsubps_avx(ZEXT1632(auVar88),ZEXT1632(auVar74));
          auVar74 = vfmadd213ps_fma(auVar103,auVar95,ZEXT1632(auVar74));
          auVar103 = vsubps_avx(ZEXT1632(auVar76),ZEXT1632(auVar88));
          auVar76 = vfmadd213ps_fma(auVar103,auVar95,ZEXT1632(auVar88));
          auVar103 = vsubps_avx(ZEXT1632(auVar76),ZEXT1632(auVar74));
          auVar236 = vfmadd231ps_fma(ZEXT1632(auVar74),auVar103,auVar95);
          auVar103 = vmulps_avx512vl(auVar103,auVar243._0_32_);
          auVar116._16_16_ = auVar103._16_16_;
          auVar76 = vmulss_avx512f(ZEXT416((uint)fVar219),SUB6416(ZEXT464(0x3eaaaaab),0));
          fVar206 = auVar76._0_4_;
          auVar179._0_8_ =
               CONCAT44(auVar236._4_4_ + fVar206 * auVar103._4_4_,
                        auVar236._0_4_ + fVar206 * auVar103._0_4_);
          auVar179._8_4_ = auVar236._8_4_ + fVar206 * auVar103._8_4_;
          auVar179._12_4_ = auVar236._12_4_ + fVar206 * auVar103._12_4_;
          auVar161._0_4_ = fVar206 * auVar103._16_4_;
          auVar161._4_4_ = fVar206 * auVar103._20_4_;
          auVar161._8_4_ = fVar206 * auVar103._24_4_;
          auVar161._12_4_ = fVar206 * auVar103._28_4_;
          auVar84 = vsubps_avx((undefined1  [16])0x0,auVar161);
          auVar88 = vshufpd_avx(auVar236,auVar236,3);
          auVar85 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
          auVar76 = vsubps_avx(auVar88,auVar236);
          auVar74 = vsubps_avx(auVar85,(undefined1  [16])0x0);
          auVar190._0_4_ = auVar76._0_4_ + auVar74._0_4_;
          auVar190._4_4_ = auVar76._4_4_ + auVar74._4_4_;
          auVar190._8_4_ = auVar76._8_4_ + auVar74._8_4_;
          auVar190._12_4_ = auVar76._12_4_ + auVar74._12_4_;
          auVar76 = vshufps_avx(auVar236,auVar236,0xb1);
          auVar74 = vshufps_avx(auVar179,auVar179,0xb1);
          auVar75 = vshufps_avx(auVar84,auVar84,0xb1);
          auVar78 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
          auVar233._4_4_ = auVar190._0_4_;
          auVar233._0_4_ = auVar190._0_4_;
          auVar233._8_4_ = auVar190._0_4_;
          auVar233._12_4_ = auVar190._0_4_;
          auVar81 = vshufps_avx(auVar190,auVar190,0x55);
          fVar206 = auVar81._0_4_;
          auVar199._0_4_ = auVar76._0_4_ * fVar206;
          fVar214 = auVar81._4_4_;
          auVar199._4_4_ = auVar76._4_4_ * fVar214;
          fVar215 = auVar81._8_4_;
          auVar199._8_4_ = auVar76._8_4_ * fVar215;
          fVar216 = auVar81._12_4_;
          auVar199._12_4_ = auVar76._12_4_ * fVar216;
          auVar207._0_4_ = auVar74._0_4_ * fVar206;
          auVar207._4_4_ = auVar74._4_4_ * fVar214;
          auVar207._8_4_ = auVar74._8_4_ * fVar215;
          auVar207._12_4_ = auVar74._12_4_ * fVar216;
          auVar220._0_4_ = auVar75._0_4_ * fVar206;
          auVar220._4_4_ = auVar75._4_4_ * fVar214;
          auVar220._8_4_ = auVar75._8_4_ * fVar215;
          auVar220._12_4_ = auVar75._12_4_ * fVar216;
          auVar191._0_4_ = auVar78._0_4_ * fVar206;
          auVar191._4_4_ = auVar78._4_4_ * fVar214;
          auVar191._8_4_ = auVar78._8_4_ * fVar215;
          auVar191._12_4_ = auVar78._12_4_ * fVar216;
          auVar76 = vfmadd231ps_fma(auVar199,auVar233,auVar236);
          auVar74 = vfmadd231ps_fma(auVar207,auVar233,auVar179);
          auVar89 = vfmadd231ps_fma(auVar220,auVar233,auVar84);
          auVar83 = vfmadd231ps_fma(auVar191,(undefined1  [16])0x0,auVar233);
          auVar81 = vshufpd_avx(auVar76,auVar76,1);
          auVar82 = vshufpd_avx(auVar74,auVar74,1);
          auVar79 = vshufpd_avx512vl(auVar89,auVar89,1);
          auVar80 = vshufpd_avx512vl(auVar83,auVar83,1);
          auVar75 = vminss_avx(auVar76,auVar74);
          auVar76 = vmaxss_avx(auVar74,auVar76);
          auVar78 = vminss_avx(auVar89,auVar83);
          auVar74 = vmaxss_avx(auVar83,auVar89);
          auVar75 = vminss_avx(auVar75,auVar78);
          auVar76 = vmaxss_avx(auVar74,auVar76);
          auVar78 = vminss_avx(auVar81,auVar82);
          auVar74 = vmaxss_avx(auVar82,auVar81);
          auVar81 = vminss_avx512f(auVar79,auVar80);
          auVar82 = vmaxss_avx512f(auVar80,auVar79);
          auVar74 = vmaxss_avx(auVar82,auVar74);
          auVar78 = vminss_avx512f(auVar78,auVar81);
          fVar214 = auVar74._0_4_;
          fVar206 = auVar76._0_4_;
          if (auVar75._0_4_ < 0.0001) {
            bVar32 = fVar214 == -0.0001;
            bVar29 = NAN(fVar214);
            if (fVar214 <= -0.0001) goto LAB_01b4cbff;
            break;
          }
LAB_01b4cbff:
          vucomiss_avx512f(auVar78);
          bVar32 = fVar214 <= -0.0001;
          bVar30 = -0.0001 < fVar206;
          bVar29 = bVar32;
          if (!bVar32) break;
          uVar14 = vcmpps_avx512vl(auVar75,SUB6416(ZEXT464(0x38d1b717),0),5);
          uVar15 = vcmpps_avx512vl(auVar78,SUB6416(ZEXT464(0x38d1b717),0),5);
          bVar20 = (byte)uVar14 & (byte)uVar15 & 1;
          bVar32 = bVar30 && bVar20 == 0;
          bVar29 = bVar30 && bVar20 == 0;
        } while (!bVar30 || bVar20 != 0);
        vcmpss_avx512f(auVar75,auVar184,1);
        auVar89 = auVar247._0_16_;
        uVar14 = vcmpss_avx512f(auVar76,auVar184,1);
        bVar30 = (bool)((byte)uVar14 & 1);
        auVar116._0_16_ = auVar89;
        iVar34 = auVar247._0_4_;
        auVar115._4_28_ = auVar116._4_28_;
        auVar115._0_4_ = (float)((uint)bVar30 * -0x40800000 + (uint)!bVar30 * iVar34);
        vucomiss_avx512f(auVar115._0_16_);
        bVar29 = (bool)(!bVar32 | bVar29);
        bVar30 = bVar29 == false;
        auVar118._16_16_ = auVar116._16_16_;
        auVar118._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
        auVar117._4_28_ = auVar118._4_28_;
        auVar117._0_4_ = (uint)bVar29 * auVar242._0_4_ + (uint)!bVar29 * 0x7f800000;
        auVar82 = auVar117._0_16_;
        auVar120._16_16_ = auVar116._16_16_;
        auVar120._0_16_ = SUB6416(ZEXT464(0xff800000),0);
        auVar119._4_28_ = auVar120._4_28_;
        auVar119._0_4_ = (uint)bVar29 * auVar242._0_4_ + (uint)!bVar29 * -0x800000;
        auVar81 = auVar119._0_16_;
        uVar14 = vcmpss_avx512f(auVar78,auVar184,1);
        bVar32 = (bool)((byte)uVar14 & 1);
        auVar122._16_16_ = auVar116._16_16_;
        auVar122._0_16_ = auVar89;
        auVar121._4_28_ = auVar122._4_28_;
        auVar121._0_4_ = (float)((uint)bVar32 * -0x40800000 + (uint)!bVar32 * iVar34);
        vucomiss_avx512f(auVar121._0_16_);
        if ((bVar29) || (bVar30)) {
          auVar78 = vucomiss_avx512f(auVar75);
          if ((bVar29) || (bVar30)) {
            auVar83 = vxorps_avx512vl(auVar75,auVar249._0_16_);
            auVar75 = vsubss_avx512f(auVar78,auVar75);
            auVar75 = vdivss_avx512f(auVar83,auVar75);
            auVar78 = vsubss_avx512f(auVar89,auVar75);
            auVar75 = vfmadd213ss_avx512f(auVar78,auVar184,auVar75);
            auVar78 = auVar75;
          }
          else {
            auVar78 = vxorps_avx512vl(auVar78,auVar78);
            vucomiss_avx512f(auVar78);
            if ((bVar29) || (auVar75 = auVar89, bVar30)) {
              auVar75 = SUB6416(ZEXT464(0xff800000),0);
              auVar78 = ZEXT416(0x7f800000);
            }
          }
          auVar82 = vminss_avx512f(auVar82,auVar78);
          auVar81 = vmaxss_avx(auVar75,auVar81);
        }
        uVar14 = vcmpss_avx512f(auVar74,auVar184,1);
        bVar32 = (bool)((byte)uVar14 & 1);
        fVar215 = (float)((uint)bVar32 * -0x40800000 + (uint)!bVar32 * iVar34);
        if ((auVar115._0_4_ != fVar215) || (NAN(auVar115._0_4_) || NAN(fVar215))) {
          if ((fVar214 != fVar206) || (NAN(fVar214) || NAN(fVar206))) {
            auVar76 = vxorps_avx512vl(auVar76,auVar249._0_16_);
            auVar192._0_4_ = auVar76._0_4_ / (fVar214 - fVar206);
            auVar192._4_12_ = auVar76._4_12_;
            auVar76 = vsubss_avx512f(auVar89,auVar192);
            auVar76 = vfmadd213ss_avx512f(auVar76,auVar184,auVar192);
            auVar74 = auVar76;
          }
          else if ((fVar206 != 0.0) ||
                  (auVar76 = auVar89, auVar74 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar206))) {
            auVar76 = SUB6416(ZEXT464(0xff800000),0);
            auVar74 = SUB6416(ZEXT464(0x7f800000),0);
          }
          auVar82 = vminss_avx(auVar82,auVar74);
          auVar81 = vmaxss_avx(auVar76,auVar81);
        }
        bVar32 = auVar121._0_4_ != fVar215;
        auVar76 = vminss_avx512f(auVar82,auVar89);
        auVar124._16_16_ = auVar116._16_16_;
        auVar124._0_16_ = auVar82;
        auVar123._4_28_ = auVar124._4_28_;
        auVar123._0_4_ = (uint)bVar32 * auVar76._0_4_ + (uint)!bVar32 * auVar82._0_4_;
        auVar76 = vmaxss_avx512f(auVar89,auVar81);
        auVar126._16_16_ = auVar116._16_16_;
        auVar126._0_16_ = auVar81;
        auVar125._4_28_ = auVar126._4_28_;
        auVar125._0_4_ = (uint)bVar32 * auVar76._0_4_ + (uint)!bVar32 * auVar81._0_4_;
        auVar76 = vmaxss_avx512f(auVar184,auVar123._0_16_);
        auVar74 = vminss_avx512f(auVar125._0_16_,auVar89);
      } while (auVar74._0_4_ < auVar76._0_4_);
      auVar82 = vmaxss_avx512f(auVar184,ZEXT416((uint)(auVar76._0_4_ + -0.1)));
      auVar83 = vminss_avx512f(ZEXT416((uint)(auVar74._0_4_ + 0.1)),auVar89);
      auVar144._0_8_ = auVar236._0_8_;
      auVar144._8_8_ = auVar144._0_8_;
      auVar208._8_8_ = auVar179._0_8_;
      auVar208._0_8_ = auVar179._0_8_;
      auVar221._8_8_ = auVar84._0_8_;
      auVar221._0_8_ = auVar84._0_8_;
      auVar76 = vshufpd_avx(auVar179,auVar179,3);
      auVar74 = vshufpd_avx(auVar84,auVar84,3);
      auVar75 = vshufps_avx(auVar82,auVar83,0);
      auVar81 = vsubps_avx512vl(auVar73,auVar75);
      fVar206 = auVar75._0_4_;
      auVar172._0_4_ = fVar206 * auVar88._0_4_;
      fVar214 = auVar75._4_4_;
      auVar172._4_4_ = fVar214 * auVar88._4_4_;
      fVar215 = auVar75._8_4_;
      auVar172._8_4_ = fVar215 * auVar88._8_4_;
      fVar216 = auVar75._12_4_;
      auVar172._12_4_ = fVar216 * auVar88._12_4_;
      auVar180._0_4_ = fVar206 * auVar76._0_4_;
      auVar180._4_4_ = fVar214 * auVar76._4_4_;
      auVar180._8_4_ = fVar215 * auVar76._8_4_;
      auVar180._12_4_ = fVar216 * auVar76._12_4_;
      auVar237._0_4_ = auVar74._0_4_ * fVar206;
      auVar237._4_4_ = auVar74._4_4_ * fVar214;
      auVar237._8_4_ = auVar74._8_4_ * fVar215;
      auVar237._12_4_ = auVar74._12_4_ * fVar216;
      auVar162._0_4_ = fVar206 * auVar85._0_4_;
      auVar162._4_4_ = fVar214 * auVar85._4_4_;
      auVar162._8_4_ = fVar215 * auVar85._8_4_;
      auVar162._12_4_ = fVar216 * auVar85._12_4_;
      auVar78 = vfmadd231ps_fma(auVar172,auVar81,auVar144);
      auVar88 = vfmadd231ps_fma(auVar180,auVar81,auVar208);
      auVar85 = vfmadd231ps_fma(auVar237,auVar81,auVar221);
      auVar81 = vfmadd231ps_fma(auVar162,auVar81,ZEXT816(0));
      auVar74 = vsubss_avx512f(auVar89,auVar82);
      auVar76 = vmovshdup_avx(auVar55);
      auVar236 = vfmadd231ss_fma(ZEXT416((uint)(auVar76._0_4_ * auVar82._0_4_)),auVar55,auVar74);
      auVar74 = vsubss_avx512f(auVar89,auVar83);
      auVar79 = vfmadd231ss_fma(ZEXT416((uint)(auVar76._0_4_ * auVar83._0_4_)),auVar55,auVar74);
      auVar82 = vdivss_avx512f(auVar89,ZEXT416((uint)fVar219));
      auVar55 = vsubps_avx(auVar88,auVar78);
      auVar84 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar74 = vmulps_avx512vl(auVar55,auVar84);
      auVar55 = vsubps_avx(auVar85,auVar88);
      auVar75 = vmulps_avx512vl(auVar55,auVar84);
      auVar55 = vsubps_avx(auVar81,auVar85);
      auVar55 = vmulps_avx512vl(auVar55,auVar84);
      auVar76 = vminps_avx(auVar75,auVar55);
      auVar55 = vmaxps_avx(auVar75,auVar55);
      auVar76 = vminps_avx(auVar74,auVar76);
      auVar55 = vmaxps_avx(auVar74,auVar55);
      auVar74 = vshufpd_avx(auVar76,auVar76,3);
      auVar75 = vshufpd_avx(auVar55,auVar55,3);
      auVar76 = vminps_avx(auVar76,auVar74);
      auVar55 = vmaxps_avx(auVar55,auVar75);
      fVar219 = auVar82._0_4_;
      auVar193._0_4_ = auVar76._0_4_ * fVar219;
      auVar193._4_4_ = auVar76._4_4_ * fVar219;
      auVar193._8_4_ = auVar76._8_4_ * fVar219;
      auVar193._12_4_ = auVar76._12_4_ * fVar219;
      auVar185._0_4_ = fVar219 * auVar55._0_4_;
      auVar185._4_4_ = fVar219 * auVar55._4_4_;
      auVar185._8_4_ = fVar219 * auVar55._8_4_;
      auVar185._12_4_ = fVar219 * auVar55._12_4_;
      auVar82 = vdivss_avx512f(auVar89,ZEXT416((uint)(auVar79._0_4_ - auVar236._0_4_)));
      auVar55 = vshufpd_avx(auVar78,auVar78,3);
      auVar76 = vshufpd_avx(auVar88,auVar88,3);
      auVar74 = vshufpd_avx(auVar85,auVar85,3);
      auVar75 = vshufpd_avx(auVar81,auVar81,3);
      auVar55 = vsubps_avx(auVar55,auVar78);
      auVar78 = vsubps_avx(auVar76,auVar88);
      auVar88 = vsubps_avx(auVar74,auVar85);
      auVar75 = vsubps_avx(auVar75,auVar81);
      auVar76 = vminps_avx(auVar55,auVar78);
      auVar55 = vmaxps_avx(auVar55,auVar78);
      auVar74 = vminps_avx(auVar88,auVar75);
      auVar74 = vminps_avx(auVar76,auVar74);
      auVar76 = vmaxps_avx(auVar88,auVar75);
      auVar55 = vmaxps_avx(auVar55,auVar76);
      fVar219 = auVar82._0_4_;
      auVar222._0_4_ = fVar219 * auVar74._0_4_;
      auVar222._4_4_ = fVar219 * auVar74._4_4_;
      auVar222._8_4_ = fVar219 * auVar74._8_4_;
      auVar222._12_4_ = fVar219 * auVar74._12_4_;
      auVar209._0_4_ = fVar219 * auVar55._0_4_;
      auVar209._4_4_ = fVar219 * auVar55._4_4_;
      auVar209._8_4_ = fVar219 * auVar55._8_4_;
      auVar209._12_4_ = fVar219 * auVar55._12_4_;
      auVar75 = vinsertps_avx(auVar77,auVar236,0x10);
      auVar80 = vpermt2ps_avx512vl(auVar77,_DAT_01fb9f90,auVar79);
      auVar140._0_4_ = auVar75._0_4_ + auVar80._0_4_;
      auVar140._4_4_ = auVar75._4_4_ + auVar80._4_4_;
      auVar140._8_4_ = auVar75._8_4_ + auVar80._8_4_;
      auVar140._12_4_ = auVar75._12_4_ + auVar80._12_4_;
      auVar82 = vmulps_avx512vl(auVar140,auVar250._0_16_);
      auVar76 = vshufps_avx(auVar82,auVar82,0x54);
      uVar134 = auVar82._0_4_;
      auVar141._4_4_ = uVar134;
      auVar141._0_4_ = uVar134;
      auVar141._8_4_ = uVar134;
      auVar141._12_4_ = uVar134;
      auVar74 = vfmadd213ps_fma(auVar35,auVar141,auVar52);
      auVar78 = vfmadd213ps_fma(auVar36,auVar141,auVar48);
      auVar88 = vfmadd213ps_fma(auVar42,auVar141,auVar51);
      auVar55 = vsubps_avx(auVar78,auVar74);
      auVar74 = vfmadd213ps_fma(auVar55,auVar141,auVar74);
      auVar55 = vsubps_avx(auVar88,auVar78);
      auVar55 = vfmadd213ps_fma(auVar55,auVar141,auVar78);
      auVar55 = vsubps_avx(auVar55,auVar74);
      auVar74 = vfmadd231ps_fma(auVar74,auVar55,auVar141);
      auVar85 = vmulps_avx512vl(auVar55,auVar84);
      auVar227._8_8_ = auVar74._0_8_;
      auVar227._0_8_ = auVar74._0_8_;
      auVar55 = vshufpd_avx(auVar74,auVar74,3);
      auVar74 = vshufps_avx(auVar82,auVar82,0x55);
      auVar78 = vsubps_avx(auVar55,auVar227);
      auVar88 = vfmadd231ps_fma(auVar227,auVar74,auVar78);
      auVar238._8_8_ = auVar85._0_8_;
      auVar238._0_8_ = auVar85._0_8_;
      auVar55 = vshufpd_avx(auVar85,auVar85,3);
      auVar55 = vsubps_avx512vl(auVar55,auVar238);
      auVar55 = vfmadd213ps_avx512vl(auVar55,auVar74,auVar238);
      auVar142._0_8_ = auVar78._0_8_ ^ 0x8000000080000000;
      auVar142._8_4_ = auVar78._8_4_ ^ 0x80000000;
      auVar142._12_4_ = auVar78._12_4_ ^ 0x80000000;
      auVar74 = vmovshdup_avx512vl(auVar55);
      auVar239._0_8_ = auVar74._0_8_ ^ 0x8000000080000000;
      auVar239._8_4_ = auVar74._8_4_ ^ 0x80000000;
      auVar239._12_4_ = auVar74._12_4_ ^ 0x80000000;
      auVar85 = vmovshdup_avx512vl(auVar78);
      auVar81 = vpermt2ps_avx512vl(auVar239,ZEXT416(5),auVar78);
      auVar74 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar74._0_4_ * auVar78._0_4_)),auVar55,auVar85);
      auVar78 = vpermt2ps_avx512vl(auVar55,SUB6416(ZEXT464(4),0),auVar142);
      auVar163._0_4_ = auVar74._0_4_;
      auVar163._4_4_ = auVar163._0_4_;
      auVar163._8_4_ = auVar163._0_4_;
      auVar163._12_4_ = auVar163._0_4_;
      auVar55 = vdivps_avx(auVar81,auVar163);
      auVar86 = vdivps_avx512vl(auVar78,auVar163);
      fVar219 = auVar88._0_4_;
      auVar74 = vshufps_avx(auVar88,auVar88,0x55);
      auVar228._0_4_ = fVar219 * auVar55._0_4_ + auVar74._0_4_ * auVar86._0_4_;
      auVar228._4_4_ = fVar219 * auVar55._4_4_ + auVar74._4_4_ * auVar86._4_4_;
      auVar228._8_4_ = fVar219 * auVar55._8_4_ + auVar74._8_4_ * auVar86._8_4_;
      auVar228._12_4_ = fVar219 * auVar55._12_4_ + auVar74._12_4_ * auVar86._12_4_;
      auVar84 = vsubps_avx(auVar76,auVar228);
      auVar74 = vmovshdup_avx(auVar55);
      auVar76 = vinsertps_avx(auVar193,auVar222,0x1c);
      auVar240._0_4_ = auVar74._0_4_ * auVar76._0_4_;
      auVar240._4_4_ = auVar74._4_4_ * auVar76._4_4_;
      auVar240._8_4_ = auVar74._8_4_ * auVar76._8_4_;
      auVar240._12_4_ = auVar74._12_4_ * auVar76._12_4_;
      auVar83 = vinsertps_avx512f(auVar185,auVar209,0x1c);
      auVar74 = vmulps_avx512vl(auVar74,auVar83);
      auVar81 = vminps_avx512vl(auVar240,auVar74);
      auVar88 = vmaxps_avx(auVar74,auVar240);
      auVar85 = vmovshdup_avx(auVar86);
      auVar74 = vinsertps_avx(auVar222,auVar193,0x4c);
      auVar223._0_4_ = auVar85._0_4_ * auVar74._0_4_;
      auVar223._4_4_ = auVar85._4_4_ * auVar74._4_4_;
      auVar223._8_4_ = auVar85._8_4_ * auVar74._8_4_;
      auVar223._12_4_ = auVar85._12_4_ * auVar74._12_4_;
      auVar78 = vinsertps_avx(auVar209,auVar185,0x4c);
      auVar210._0_4_ = auVar85._0_4_ * auVar78._0_4_;
      auVar210._4_4_ = auVar85._4_4_ * auVar78._4_4_;
      auVar210._8_4_ = auVar85._8_4_ * auVar78._8_4_;
      auVar210._12_4_ = auVar85._12_4_ * auVar78._12_4_;
      auVar85 = vminps_avx(auVar223,auVar210);
      auVar81 = vaddps_avx512vl(auVar81,auVar85);
      auVar85 = vmaxps_avx(auVar210,auVar223);
      auVar211._0_4_ = auVar88._0_4_ + auVar85._0_4_;
      auVar211._4_4_ = auVar88._4_4_ + auVar85._4_4_;
      auVar211._8_4_ = auVar88._8_4_ + auVar85._8_4_;
      auVar211._12_4_ = auVar88._12_4_ + auVar85._12_4_;
      auVar224._8_8_ = 0x3f80000000000000;
      auVar224._0_8_ = 0x3f80000000000000;
      auVar88 = vsubps_avx(auVar224,auVar211);
      auVar85 = vsubps_avx(auVar224,auVar81);
      auVar81 = vsubps_avx(auVar75,auVar82);
      auVar82 = vsubps_avx(auVar80,auVar82);
      fVar216 = auVar81._0_4_;
      auVar241._0_4_ = fVar216 * auVar88._0_4_;
      fVar217 = auVar81._4_4_;
      auVar241._4_4_ = fVar217 * auVar88._4_4_;
      fVar218 = auVar81._8_4_;
      auVar241._8_4_ = fVar218 * auVar88._8_4_;
      fVar151 = auVar81._12_4_;
      auVar241._12_4_ = fVar151 * auVar88._12_4_;
      auVar87 = vbroadcastss_avx512vl(auVar55);
      auVar76 = vmulps_avx512vl(auVar87,auVar76);
      auVar83 = vmulps_avx512vl(auVar87,auVar83);
      auVar87 = vminps_avx512vl(auVar76,auVar83);
      auVar83 = vmaxps_avx512vl(auVar83,auVar76);
      auVar76 = vbroadcastss_avx512vl(auVar86);
      auVar74 = vmulps_avx512vl(auVar76,auVar74);
      auVar76 = vmulps_avx512vl(auVar76,auVar78);
      auVar78 = vminps_avx512vl(auVar74,auVar76);
      auVar78 = vaddps_avx512vl(auVar87,auVar78);
      auVar81 = vmulps_avx512vl(auVar81,auVar85);
      fVar219 = auVar82._0_4_;
      auVar212._0_4_ = fVar219 * auVar88._0_4_;
      fVar206 = auVar82._4_4_;
      auVar212._4_4_ = fVar206 * auVar88._4_4_;
      fVar214 = auVar82._8_4_;
      auVar212._8_4_ = fVar214 * auVar88._8_4_;
      fVar215 = auVar82._12_4_;
      auVar212._12_4_ = fVar215 * auVar88._12_4_;
      auVar225._0_4_ = fVar219 * auVar85._0_4_;
      auVar225._4_4_ = fVar206 * auVar85._4_4_;
      auVar225._8_4_ = fVar214 * auVar85._8_4_;
      auVar225._12_4_ = fVar215 * auVar85._12_4_;
      auVar76 = vmaxps_avx(auVar76,auVar74);
      auVar186._0_4_ = auVar83._0_4_ + auVar76._0_4_;
      auVar186._4_4_ = auVar83._4_4_ + auVar76._4_4_;
      auVar186._8_4_ = auVar83._8_4_ + auVar76._8_4_;
      auVar186._12_4_ = auVar83._12_4_ + auVar76._12_4_;
      auVar194._8_8_ = 0x3f800000;
      auVar194._0_8_ = 0x3f800000;
      auVar76 = vsubps_avx(auVar194,auVar186);
      auVar74 = vsubps_avx512vl(auVar194,auVar78);
      auVar234._0_4_ = fVar216 * auVar76._0_4_;
      auVar234._4_4_ = fVar217 * auVar76._4_4_;
      auVar234._8_4_ = fVar218 * auVar76._8_4_;
      auVar234._12_4_ = fVar151 * auVar76._12_4_;
      auVar229._0_4_ = fVar216 * auVar74._0_4_;
      auVar229._4_4_ = fVar217 * auVar74._4_4_;
      auVar229._8_4_ = fVar218 * auVar74._8_4_;
      auVar229._12_4_ = fVar151 * auVar74._12_4_;
      auVar187._0_4_ = fVar219 * auVar76._0_4_;
      auVar187._4_4_ = fVar206 * auVar76._4_4_;
      auVar187._8_4_ = fVar214 * auVar76._8_4_;
      auVar187._12_4_ = fVar215 * auVar76._12_4_;
      auVar195._0_4_ = fVar219 * auVar74._0_4_;
      auVar195._4_4_ = fVar206 * auVar74._4_4_;
      auVar195._8_4_ = fVar214 * auVar74._8_4_;
      auVar195._12_4_ = fVar215 * auVar74._12_4_;
      auVar76 = vminps_avx(auVar234,auVar229);
      auVar74 = vminps_avx512vl(auVar187,auVar195);
      auVar78 = vminps_avx512vl(auVar76,auVar74);
      auVar76 = vmaxps_avx(auVar229,auVar234);
      auVar74 = vmaxps_avx(auVar195,auVar187);
      auVar74 = vmaxps_avx(auVar74,auVar76);
      auVar88 = vminps_avx512vl(auVar241,auVar81);
      auVar76 = vminps_avx(auVar212,auVar225);
      auVar76 = vminps_avx(auVar88,auVar76);
      auVar76 = vhaddps_avx(auVar78,auVar76);
      auVar88 = vmaxps_avx512vl(auVar81,auVar241);
      auVar78 = vmaxps_avx(auVar225,auVar212);
      auVar78 = vmaxps_avx(auVar78,auVar88);
      auVar74 = vhaddps_avx(auVar74,auVar78);
      auVar76 = vshufps_avx(auVar76,auVar76,0xe8);
      auVar74 = vshufps_avx(auVar74,auVar74,0xe8);
      auVar188._0_4_ = auVar76._0_4_ + auVar84._0_4_;
      auVar188._4_4_ = auVar76._4_4_ + auVar84._4_4_;
      auVar188._8_4_ = auVar76._8_4_ + auVar84._8_4_;
      auVar188._12_4_ = auVar76._12_4_ + auVar84._12_4_;
      auVar196._0_4_ = auVar74._0_4_ + auVar84._0_4_;
      auVar196._4_4_ = auVar74._4_4_ + auVar84._4_4_;
      auVar196._8_4_ = auVar74._8_4_ + auVar84._8_4_;
      auVar196._12_4_ = auVar74._12_4_ + auVar84._12_4_;
      auVar76 = vmaxps_avx(auVar75,auVar188);
      auVar74 = vminps_avx(auVar196,auVar80);
      uVar33 = vcmpps_avx512vl(auVar74,auVar76,1);
    } while ((uVar33 & 3) != 0);
    uVar33 = vcmpps_avx512vl(auVar196,auVar80,1);
    uVar14 = vcmpps_avx512vl(auVar77,auVar188,1);
    if (((ushort)uVar14 & (ushort)uVar33 & 1) == 0) {
      bVar20 = 0;
    }
    else {
      auVar76 = vmovshdup_avx(auVar188);
      bVar20 = auVar236._0_4_ < auVar76._0_4_ & (byte)(uVar33 >> 1) & 0x7f;
    }
    p03.field_0.i[0] = auVar56._0_4_;
    p03.field_0.i[1] = auVar56._4_4_;
    p03.field_0.i[2] = auVar56._8_4_;
    p03.field_0.i[3] = auVar56._12_4_;
    if (((3 < (uint)uVar23 || uVar7 != 0 && !bVar31) | bVar20) == 1) {
      lVar25 = 0xc9;
      do {
        lVar25 = lVar25 + -1;
        if (lVar25 == 0) goto LAB_01b4c9d3;
        auVar77 = vsubss_avx512f(auVar89,auVar84);
        fVar214 = auVar77._0_4_;
        fVar219 = fVar214 * fVar214 * fVar214;
        auVar77 = vmulss_avx512f(auVar84,ZEXT416(0x40400000));
        fVar206 = auVar77._0_4_ * fVar214 * fVar214;
        fVar215 = auVar84._0_4_;
        auVar77 = vmulss_avx512f(ZEXT416((uint)(fVar215 * fVar215)),ZEXT416(0x40400000));
        fVar214 = fVar214 * auVar77._0_4_;
        auVar152._4_4_ = fVar219;
        auVar152._0_4_ = fVar219;
        auVar152._8_4_ = fVar219;
        auVar152._12_4_ = fVar219;
        auVar145._4_4_ = fVar206;
        auVar145._0_4_ = fVar206;
        auVar145._8_4_ = fVar206;
        auVar145._12_4_ = fVar206;
        auVar137._4_4_ = fVar214;
        auVar137._0_4_ = fVar214;
        auVar137._8_4_ = fVar214;
        auVar137._12_4_ = fVar214;
        fVar215 = fVar215 * fVar215 * fVar215;
        auVar173._0_4_ = p03.field_0.v[0] * fVar215;
        auVar173._4_4_ = p03.field_0.v[1] * fVar215;
        auVar173._8_4_ = p03.field_0.v[2] * fVar215;
        auVar173._12_4_ = p03.field_0.v[3] * fVar215;
        auVar77 = vfmadd231ps_fma(auVar173,auVar51,auVar137);
        auVar77 = vfmadd231ps_fma(auVar77,auVar48,auVar145);
        auVar77 = vfmadd231ps_fma(auVar77,auVar52,auVar152);
        auVar138._8_8_ = auVar77._0_8_;
        auVar138._0_8_ = auVar77._0_8_;
        auVar77 = vshufpd_avx(auVar77,auVar77,3);
        auVar76 = vshufps_avx(auVar84,auVar84,0x55);
        auVar77 = vsubps_avx(auVar77,auVar138);
        auVar76 = vfmadd213ps_fma(auVar77,auVar76,auVar138);
        fVar219 = auVar76._0_4_;
        auVar77 = vshufps_avx(auVar76,auVar76,0x55);
        auVar139._0_4_ = auVar55._0_4_ * fVar219 + auVar86._0_4_ * auVar77._0_4_;
        auVar139._4_4_ = auVar55._4_4_ * fVar219 + auVar86._4_4_ * auVar77._4_4_;
        auVar139._8_4_ = auVar55._8_4_ * fVar219 + auVar86._8_4_ * auVar77._8_4_;
        auVar139._12_4_ = auVar55._12_4_ * fVar219 + auVar86._12_4_ * auVar77._12_4_;
        auVar84 = vsubps_avx(auVar84,auVar139);
        auVar77 = vandps_avx512vl(auVar76,auVar248._0_16_);
        auVar76 = vprolq_avx512vl(auVar77,0x20);
        auVar77 = vmaxss_avx(auVar76,auVar77);
        bVar31 = auVar77._0_4_ <= fVar168;
      } while (fVar168 <= auVar77._0_4_);
      auVar55 = vucomiss_avx512f(auVar184);
      if (bVar31) {
        auVar77 = vucomiss_avx512f(auVar55);
        auVar247 = ZEXT1664(auVar77);
        if (bVar31) {
          vmovshdup_avx(auVar55);
          auVar77 = vucomiss_avx512f(auVar184);
          if (bVar31) {
            auVar76 = vucomiss_avx512f(auVar77);
            auVar247 = ZEXT1664(auVar76);
            if (bVar31) {
              auVar74 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                      ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
              auVar84 = vinsertps_avx(auVar74,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),
                                      0x28);
              auVar74 = vdpps_avx(auVar84,auVar44,0x7f);
              auVar75 = vdpps_avx(auVar84,auVar60,0x7f);
              auVar78 = vdpps_avx(auVar84,auVar61,0x7f);
              auVar88 = vdpps_avx(auVar84,auVar49,0x7f);
              auVar85 = vdpps_avx(auVar84,auVar62,0x7f);
              auVar81 = vdpps_avx(auVar84,auVar63,0x7f);
              auVar82 = vdpps_avx(auVar84,auVar64,0x7f);
              auVar84 = vdpps_avx(auVar84,auVar50,0x7f);
              auVar89 = vsubss_avx512f(auVar76,auVar77);
              fVar215 = auVar77._0_4_;
              auVar77 = vfmadd231ss_fma(ZEXT416((uint)(fVar215 * auVar85._0_4_)),auVar89,auVar74);
              auVar74 = vfmadd231ss_fma(ZEXT416((uint)(auVar81._0_4_ * fVar215)),auVar89,auVar75);
              auVar75 = vfmadd231ss_fma(ZEXT416((uint)(auVar82._0_4_ * fVar215)),auVar89,auVar78);
              auVar78 = vfmadd231ss_fma(ZEXT416((uint)(fVar215 * auVar84._0_4_)),auVar89,auVar88);
              auVar76 = vsubss_avx512f(auVar76,auVar55);
              auVar197._0_4_ = auVar76._0_4_;
              fVar219 = auVar197._0_4_ * auVar197._0_4_ * auVar197._0_4_;
              auVar76 = vmulss_avx512f(auVar55,ZEXT416(0x40400000));
              fVar206 = auVar76._0_4_ * auVar197._0_4_ * auVar197._0_4_;
              local_d8 = auVar55._0_4_;
              auVar153._0_4_ = local_d8 * local_d8;
              auVar153._4_4_ = auVar55._4_4_ * auVar55._4_4_;
              auVar153._8_4_ = auVar55._8_4_ * auVar55._8_4_;
              auVar153._12_4_ = auVar55._12_4_ * auVar55._12_4_;
              auVar76 = vmulss_avx512f(auVar153,ZEXT416(0x40400000));
              fVar214 = auVar197._0_4_ * auVar76._0_4_;
              fVar217 = local_d8 * auVar153._0_4_;
              auVar76 = vfmadd231ss_fma(ZEXT416((uint)(fVar217 * auVar78._0_4_)),
                                        ZEXT416((uint)fVar214),auVar75);
              auVar76 = vfmadd231ss_fma(auVar76,ZEXT416((uint)fVar206),auVar74);
              auVar77 = vfmadd231ss_fma(auVar76,ZEXT416((uint)fVar219),auVar77);
              fVar216 = auVar77._0_4_;
              if ((fVar169 <= fVar216) &&
                 (fVar218 = *(float *)(ray + k * 4 + 0x80), fVar216 <= fVar218)) {
                local_c8 = vshufps_avx(auVar55,auVar55,0x55);
                auVar73 = vsubps_avx512vl(auVar73,local_c8);
                local_288 = auVar43._0_4_;
                fStack_284 = auVar43._4_4_;
                fStack_280 = auVar43._8_4_;
                fStack_27c = auVar43._12_4_;
                fVar151 = local_c8._0_4_;
                auVar200._0_4_ = fVar151 * local_288;
                fVar156 = local_c8._4_4_;
                auVar200._4_4_ = fVar156 * fStack_284;
                fVar157 = local_c8._8_4_;
                auVar200._8_4_ = fVar157 * fStack_280;
                fVar158 = local_c8._12_4_;
                auVar200._12_4_ = fVar158 * fStack_27c;
                local_298 = auVar59._0_4_;
                fStack_294 = auVar59._4_4_;
                fStack_290 = auVar59._8_4_;
                fStack_28c = auVar59._12_4_;
                auVar213._0_4_ = fVar151 * local_298;
                auVar213._4_4_ = fVar156 * fStack_294;
                auVar213._8_4_ = fVar157 * fStack_290;
                auVar213._12_4_ = fVar158 * fStack_28c;
                local_2a8 = auVar45._0_4_;
                fStack_2a4 = auVar45._4_4_;
                fStack_2a0 = auVar45._8_4_;
                fStack_29c = auVar45._12_4_;
                auVar226._0_4_ = fVar151 * local_2a8;
                auVar226._4_4_ = fVar156 * fStack_2a4;
                auVar226._8_4_ = fVar157 * fStack_2a0;
                auVar226._12_4_ = fVar158 * fStack_29c;
                local_2b8 = auVar135._0_4_;
                fStack_2b4 = auVar135._4_4_;
                fStack_2b0 = auVar135._8_4_;
                fStack_2ac = auVar135._12_4_;
                auVar230._0_4_ = fVar151 * local_2b8;
                auVar230._4_4_ = fVar156 * fStack_2b4;
                auVar230._8_4_ = fVar157 * fStack_2b0;
                auVar230._12_4_ = fVar158 * fStack_2ac;
                auVar55 = vfmadd231ps_fma(auVar200,auVar73,auVar47);
                auVar77 = vfmadd231ps_fma(auVar213,auVar73,auVar54);
                auVar76 = vfmadd231ps_fma(auVar226,auVar73,auVar58);
                auVar73 = vfmadd231ps_fma(auVar230,auVar73,auVar57);
                auVar55 = vsubps_avx(auVar77,auVar55);
                auVar77 = vsubps_avx(auVar76,auVar77);
                auVar76 = vsubps_avx(auVar73,auVar76);
                auVar231._0_4_ = local_d8 * auVar77._0_4_;
                auVar231._4_4_ = local_d8 * auVar77._4_4_;
                auVar231._8_4_ = local_d8 * auVar77._8_4_;
                auVar231._12_4_ = local_d8 * auVar77._12_4_;
                auVar197._4_4_ = auVar197._0_4_;
                auVar197._8_4_ = auVar197._0_4_;
                auVar197._12_4_ = auVar197._0_4_;
                auVar55 = vfmadd231ps_fma(auVar231,auVar197,auVar55);
                auVar201._0_4_ = local_d8 * auVar76._0_4_;
                auVar201._4_4_ = local_d8 * auVar76._4_4_;
                auVar201._8_4_ = local_d8 * auVar76._8_4_;
                auVar201._12_4_ = local_d8 * auVar76._12_4_;
                auVar77 = vfmadd231ps_fma(auVar201,auVar197,auVar77);
                auVar202._0_4_ = local_d8 * auVar77._0_4_;
                auVar202._4_4_ = local_d8 * auVar77._4_4_;
                auVar202._8_4_ = local_d8 * auVar77._8_4_;
                auVar202._12_4_ = local_d8 * auVar77._12_4_;
                auVar55 = vfmadd231ps_fma(auVar202,auVar197,auVar55);
                auVar18._8_4_ = 0x40400000;
                auVar18._0_8_ = 0x4040000040400000;
                auVar18._12_4_ = 0x40400000;
                auVar55 = vmulps_avx512vl(auVar55,auVar18);
                pGVar8 = (context->scene->geometries).items[uVar22].ptr;
                if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  local_2f8 = auVar53._0_4_;
                  fStack_2f4 = auVar53._4_4_;
                  fStack_2f0 = auVar53._8_4_;
                  fStack_2ec = auVar53._12_4_;
                  auVar181._0_4_ = fVar217 * local_2f8;
                  auVar181._4_4_ = fVar217 * fStack_2f4;
                  auVar181._8_4_ = fVar217 * fStack_2f0;
                  auVar181._12_4_ = fVar217 * fStack_2ec;
                  auVar174._4_4_ = fVar214;
                  auVar174._0_4_ = fVar214;
                  auVar174._8_4_ = fVar214;
                  auVar174._12_4_ = fVar214;
                  auVar77 = vfmadd132ps_fma(auVar174,auVar181,auVar70);
                  auVar164._4_4_ = fVar206;
                  auVar164._0_4_ = fVar206;
                  auVar164._8_4_ = fVar206;
                  auVar164._12_4_ = fVar206;
                  auVar77 = vfmadd132ps_fma(auVar164,auVar77,auVar69);
                  auVar146._4_4_ = fVar219;
                  auVar146._0_4_ = fVar219;
                  auVar146._8_4_ = fVar219;
                  auVar146._12_4_ = fVar219;
                  auVar73 = vfmadd132ps_fma(auVar146,auVar77,auVar68);
                  auVar77 = vshufps_avx(auVar73,auVar73,0xc9);
                  auVar76 = vshufps_avx(auVar55,auVar55,0xc9);
                  auVar147._0_4_ = auVar73._0_4_ * auVar76._0_4_;
                  auVar147._4_4_ = auVar73._4_4_ * auVar76._4_4_;
                  auVar147._8_4_ = auVar73._8_4_ * auVar76._8_4_;
                  auVar147._12_4_ = auVar73._12_4_ * auVar76._12_4_;
                  auVar55 = vfmsub231ps_fma(auVar147,auVar55,auVar77);
                  local_e8 = auVar55._0_4_;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x80) = fVar216;
                    uVar134 = vextractps_avx(auVar55,1);
                    *(undefined4 *)(ray + k * 4 + 0xc0) = uVar134;
                    uVar134 = vextractps_avx(auVar55,2);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = uVar134;
                    *(undefined4 *)(ray + k * 4 + 0xe0) = local_e8;
                    *(float *)(ray + k * 4 + 0xf0) = local_d8;
                    *(float *)(ray + k * 4 + 0x100) = fVar215;
                    *(uint *)(ray + k * 4 + 0x110) = uVar6;
                    *(int *)(ray + k * 4 + 0x120) = (int)uVar22;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                    goto LAB_01b4c9d3;
                  }
                  auVar77 = vshufps_avx(auVar55,auVar55,0x55);
                  local_f8 = vshufps_avx(auVar55,auVar55,0xaa);
                  local_108[0] = (RTCHitN)auVar77[0];
                  local_108[1] = (RTCHitN)auVar77[1];
                  local_108[2] = (RTCHitN)auVar77[2];
                  local_108[3] = (RTCHitN)auVar77[3];
                  local_108[4] = (RTCHitN)auVar77[4];
                  local_108[5] = (RTCHitN)auVar77[5];
                  local_108[6] = (RTCHitN)auVar77[6];
                  local_108[7] = (RTCHitN)auVar77[7];
                  local_108[8] = (RTCHitN)auVar77[8];
                  local_108[9] = (RTCHitN)auVar77[9];
                  local_108[10] = (RTCHitN)auVar77[10];
                  local_108[0xb] = (RTCHitN)auVar77[0xb];
                  local_108[0xc] = (RTCHitN)auVar77[0xc];
                  local_108[0xd] = (RTCHitN)auVar77[0xd];
                  local_108[0xe] = (RTCHitN)auVar77[0xe];
                  local_108[0xf] = (RTCHitN)auVar77[0xf];
                  uStack_e4 = local_e8;
                  uStack_e0 = local_e8;
                  uStack_dc = local_e8;
                  fStack_d4 = local_d8;
                  fStack_d0 = local_d8;
                  fStack_cc = local_d8;
                  local_318 = auVar72._0_8_;
                  uStack_310 = auVar72._8_8_;
                  local_b8 = local_318;
                  uStack_b0 = uStack_310;
                  local_a8 = auVar71;
                  vpcmpeqd_avx2(ZEXT1632(auVar71),ZEXT1632(auVar71));
                  uStack_94 = context->user->instID[0];
                  local_98 = uStack_94;
                  uStack_90 = uStack_94;
                  uStack_8c = uStack_94;
                  uStack_88 = context->user->instPrimID[0];
                  uStack_84 = uStack_88;
                  uStack_80 = uStack_88;
                  uStack_7c = uStack_88;
                  *(float *)(ray + k * 4 + 0x80) = fVar216;
                  args.valid = (int *)local_388;
                  args.geometryUserPtr = pGVar8->userPtr;
                  args.context = context->user;
                  args.hit = local_108;
                  args.N = 4;
                  local_388 = auVar37;
                  args.ray = (RTCRayN *)ray;
                  if (pGVar8->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    local_378 = uVar22;
                    (*pGVar8->intersectionFilterN)(&args);
                    auVar246 = ZEXT3264(_DAT_01fb9fe0);
                    auVar55 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar245 = ZEXT1664(auVar55);
                    auVar55 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                    auVar244 = ZEXT1664(auVar55);
                    auVar103 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                    auVar243 = ZEXT3264(auVar103);
                    auVar55 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                    auVar249 = ZEXT1664(auVar55);
                    auVar55 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    auVar248 = ZEXT1664(auVar55);
                    auVar247 = ZEXT464(0x3f800000);
                    auVar55 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                    auVar250 = ZEXT1664(auVar55);
                    auVar55 = vxorps_avx512vl(auVar184,auVar184);
                    auVar242 = ZEXT1664(auVar55);
                    uVar22 = local_378;
                  }
                  auVar55 = auVar242._0_16_;
                  uVar33 = vptestmd_avx512vl(local_388,local_388);
                  if ((uVar33 & 0xf) != 0) {
                    p_Var13 = context->args->filter;
                    if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var13)(&args);
                      auVar246 = ZEXT3264(_DAT_01fb9fe0);
                      auVar77 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                      auVar245 = ZEXT1664(auVar77);
                      auVar77 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                      auVar244 = ZEXT1664(auVar77);
                      auVar103 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                      auVar243 = ZEXT3264(auVar103);
                      auVar77 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                      auVar249 = ZEXT1664(auVar77);
                      auVar77 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                      auVar248 = ZEXT1664(auVar77);
                      auVar247 = ZEXT464(0x3f800000);
                      auVar77 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                      auVar250 = ZEXT1664(auVar77);
                      auVar55 = vxorps_avx512vl(auVar55,auVar55);
                      auVar242 = ZEXT1664(auVar55);
                    }
                    uVar33 = vptestmd_avx512vl(local_388,local_388);
                    uVar33 = uVar33 & 0xf;
                    bVar20 = (byte)uVar33;
                    if (bVar20 != 0) {
                      iVar34 = *(int *)(args.hit + 4);
                      iVar127 = *(int *)(args.hit + 8);
                      iVar128 = *(int *)(args.hit + 0xc);
                      bVar31 = (bool)((byte)(uVar33 >> 1) & 1);
                      bVar32 = (bool)((byte)(uVar33 >> 2) & 1);
                      bVar29 = SUB81(uVar33 >> 3,0);
                      *(uint *)(args.ray + 0xc0) =
                           (uint)(bVar20 & 1) * *(int *)args.hit |
                           (uint)!(bool)(bVar20 & 1) * *(uint *)(args.ray + 0xc0);
                      *(uint *)(args.ray + 0xc4) =
                           (uint)bVar31 * iVar34 | (uint)!bVar31 * *(int *)(args.ray + 0xc4);
                      *(uint *)(args.ray + 200) =
                           (uint)bVar32 * iVar127 | (uint)!bVar32 * *(int *)(args.ray + 200);
                      *(uint *)(args.ray + 0xcc) =
                           (uint)bVar29 * iVar128 | (uint)!bVar29 * *(int *)(args.ray + 0xcc);
                      iVar34 = *(int *)(args.hit + 0x14);
                      iVar127 = *(int *)(args.hit + 0x18);
                      iVar128 = *(int *)(args.hit + 0x1c);
                      bVar31 = (bool)((byte)(uVar33 >> 1) & 1);
                      bVar32 = (bool)((byte)(uVar33 >> 2) & 1);
                      bVar29 = SUB81(uVar33 >> 3,0);
                      *(uint *)(args.ray + 0xd0) =
                           (uint)(bVar20 & 1) * *(int *)(args.hit + 0x10) |
                           (uint)!(bool)(bVar20 & 1) * *(uint *)(args.ray + 0xd0);
                      *(uint *)(args.ray + 0xd4) =
                           (uint)bVar31 * iVar34 | (uint)!bVar31 * *(int *)(args.ray + 0xd4);
                      *(uint *)(args.ray + 0xd8) =
                           (uint)bVar32 * iVar127 | (uint)!bVar32 * *(int *)(args.ray + 0xd8);
                      *(uint *)(args.ray + 0xdc) =
                           (uint)bVar29 * iVar128 | (uint)!bVar29 * *(int *)(args.ray + 0xdc);
                      iVar34 = *(int *)(args.hit + 0x24);
                      iVar127 = *(int *)(args.hit + 0x28);
                      iVar128 = *(int *)(args.hit + 0x2c);
                      bVar31 = (bool)((byte)(uVar33 >> 1) & 1);
                      bVar32 = (bool)((byte)(uVar33 >> 2) & 1);
                      bVar29 = SUB81(uVar33 >> 3,0);
                      *(uint *)(args.ray + 0xe0) =
                           (uint)(bVar20 & 1) * *(int *)(args.hit + 0x20) |
                           (uint)!(bool)(bVar20 & 1) * *(uint *)(args.ray + 0xe0);
                      *(uint *)(args.ray + 0xe4) =
                           (uint)bVar31 * iVar34 | (uint)!bVar31 * *(int *)(args.ray + 0xe4);
                      *(uint *)(args.ray + 0xe8) =
                           (uint)bVar32 * iVar127 | (uint)!bVar32 * *(int *)(args.ray + 0xe8);
                      *(uint *)(args.ray + 0xec) =
                           (uint)bVar29 * iVar128 | (uint)!bVar29 * *(int *)(args.ray + 0xec);
                      iVar34 = *(int *)(args.hit + 0x34);
                      iVar127 = *(int *)(args.hit + 0x38);
                      iVar128 = *(int *)(args.hit + 0x3c);
                      bVar31 = (bool)((byte)(uVar33 >> 1) & 1);
                      bVar32 = (bool)((byte)(uVar33 >> 2) & 1);
                      bVar29 = SUB81(uVar33 >> 3,0);
                      *(uint *)(args.ray + 0xf0) =
                           (uint)(bVar20 & 1) * *(int *)(args.hit + 0x30) |
                           (uint)!(bool)(bVar20 & 1) * *(uint *)(args.ray + 0xf0);
                      *(uint *)(args.ray + 0xf4) =
                           (uint)bVar31 * iVar34 | (uint)!bVar31 * *(int *)(args.ray + 0xf4);
                      *(uint *)(args.ray + 0xf8) =
                           (uint)bVar32 * iVar127 | (uint)!bVar32 * *(int *)(args.ray + 0xf8);
                      *(uint *)(args.ray + 0xfc) =
                           (uint)bVar29 * iVar128 | (uint)!bVar29 * *(int *)(args.ray + 0xfc);
                      iVar34 = *(int *)(args.hit + 0x44);
                      iVar127 = *(int *)(args.hit + 0x48);
                      iVar128 = *(int *)(args.hit + 0x4c);
                      bVar31 = (bool)((byte)(uVar33 >> 1) & 1);
                      bVar32 = (bool)((byte)(uVar33 >> 2) & 1);
                      bVar29 = SUB81(uVar33 >> 3,0);
                      *(uint *)(args.ray + 0x100) =
                           (uint)(bVar20 & 1) * *(int *)(args.hit + 0x40) |
                           (uint)!(bool)(bVar20 & 1) * *(uint *)(args.ray + 0x100);
                      *(uint *)(args.ray + 0x104) =
                           (uint)bVar31 * iVar34 | (uint)!bVar31 * *(int *)(args.ray + 0x104);
                      *(uint *)(args.ray + 0x108) =
                           (uint)bVar32 * iVar127 | (uint)!bVar32 * *(int *)(args.ray + 0x108);
                      *(uint *)(args.ray + 0x10c) =
                           (uint)bVar29 * iVar128 | (uint)!bVar29 * *(int *)(args.ray + 0x10c);
                      auVar55 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x50));
                      *(undefined1 (*) [16])(args.ray + 0x110) = auVar55;
                      auVar55 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x60));
                      *(undefined1 (*) [16])(args.ray + 0x120) = auVar55;
                      auVar55 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x70));
                      *(undefined1 (*) [16])(args.ray + 0x130) = auVar55;
                      auVar55 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x80));
                      *(undefined1 (*) [16])(args.ray + 0x140) = auVar55;
                      goto LAB_01b4c9d3;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x80) = fVar218;
                }
              }
            }
          }
        }
      }
      goto LAB_01b4c9d3;
    }
    auVar55 = vinsertps_avx(auVar236,auVar79,0x10);
  } while( true );
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }